

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

void estimate_space_upto_test(bool multi_kv)

{
  uint64_t *puVar1;
  short *psVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  uint64_t extraout_RAX;
  uint64_t uVar9;
  fdb_kvs_handle *handle;
  fdb_kvs_handle *doc;
  fdb_kvs_handle *pfVar10;
  fdb_kvs_config *config;
  fdb_kvs_info *info;
  fdb_file_info *kvs_config_00;
  char *pcVar11;
  void *__s2;
  size_t sVar12;
  code *__s;
  void *pvVar13;
  fdb_kvs_handle **ppfVar14;
  fdb_kvs_handle *pfVar15;
  char *pcVar16;
  char cVar17;
  fdb_kvs_handle *pfVar18;
  fdb_file_info *info_00;
  undefined7 in_register_00000039;
  fdb_file_handle *pfVar19;
  fdb_kvs_handle *ptr_fhandle;
  undefined1 handle_00 [8];
  uint uVar20;
  bool *pbVar21;
  ulong uVar22;
  long lVar23;
  btree *config_00;
  fdb_config *pfVar24;
  ulong uVar25;
  size_t sVar26;
  btree *ptr_fhandle_00;
  fdb_doc **ppfVar27;
  __atomic_base<unsigned_long> _Var28;
  timeval tVar29;
  timeval tVar30;
  fdb_file_handle *dbfile;
  fdb_snapshot_info_t *markers;
  uint64_t num_markers;
  fdb_kvs_config kvs_config;
  char kv_name [8];
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_17088;
  undefined1 auStack_17080 [16];
  undefined1 auStack_17070 [8];
  undefined1 auStack_17068 [80];
  ulong uStack_17018;
  timeval tStack_16ff8;
  fdb_file_info afStack_16fe8 [3];
  fdb_file_info afStack_16ee8 [3];
  fdb_config fStack_16de8;
  fdb_kvs_handle *pfStack_16cf0;
  fdb_kvs_handle *pfStack_16ce8;
  fdb_kvs_handle *pfStack_16ce0;
  fdb_config *pfStack_16cd8;
  fdb_doc **ppfStack_16cd0;
  fdb_kvs_handle *pfStack_16cc8;
  fdb_file_handle *pfStack_16cb8;
  fdb_kvs_handle *pfStack_16cb0;
  timeval atStack_16ca8 [2];
  timeval tStack_16c88;
  timeval tStack_16c78;
  undefined1 auStack_16c68 [70];
  undefined1 uStack_16c22;
  undefined8 uStack_16c18;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_16b58;
  fdb_kvs_handle *pfStack_16b50;
  fdb_kvs_handle *pfStack_16b48;
  fdb_kvs_handle *pfStack_16b40;
  fdb_doc **ppfStack_16b38;
  fdb_kvs_handle *pfStack_16b30;
  undefined1 auStack_16b18 [16];
  fdb_kvs_handle *pfStack_16b08;
  fdb_kvs_handle *pfStack_16b00;
  fdb_kvs_handle *pfStack_16af8;
  fdb_kvs_handle *pfStack_16af0;
  fdb_kvs_handle *pfStack_16ae8;
  fdb_kvs_config fStack_16ae0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_16ac8;
  filemgr *pfStack_16ac0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_16ab8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_16ab0;
  filemgr *pfStack_16aa8;
  fdb_kvs_handle *pfStack_16aa0;
  timeval tStack_16a98;
  undefined1 auStack_16a88 [256];
  __atomic_base<unsigned_long> _Stack_16988;
  timeval tStack_16980;
  __atomic_base<unsigned_long> _Stack_16970;
  fdb_doc *apfStack_16928 [32];
  char acStack_16828 [256];
  char acStack_16728 [256];
  fdb_kvs_handle afStack_16628 [153];
  char acStack_2da8 [8];
  fdb_kvs_handle *pfStack_2da0;
  fdb_kvs_handle *pfStack_2d98;
  fdb_kvs_handle *pfStack_2d90;
  fdb_kvs_handle *pfStack_2d88;
  fdb_doc **ppfStack_2d80;
  fdb_kvs_handle *pfStack_2d78;
  fdb_kvs_handle *pfStack_2d60;
  fdb_kvs_handle *pfStack_2d58;
  fdb_doc *pfStack_2d50;
  void *pvStack_2d48;
  fdb_kvs_config fStack_2d40;
  undefined1 auStack_2d28 [48];
  timeval tStack_2cf8;
  undefined1 auStack_2ce8 [760];
  char acStack_29f0 [256];
  fdb_doc *apfStack_28f0 [101];
  fdb_kvs_handle **ppfStack_25c8;
  fdb_kvs_handle *pfStack_25c0;
  fdb_kvs_handle *pfStack_25b8;
  fdb_kvs_info *pfStack_25b0;
  fdb_doc **ppfStack_25a8;
  fdb_kvs_handle *pfStack_25a0;
  undefined1 auStack_2588 [16];
  undefined1 auStack_2578 [24];
  undefined1 auStack_2560 [32];
  fdb_kvs_handle *apfStack_2540 [5];
  timeval tStack_2518;
  char acStack_2508 [256];
  fdb_doc *apfStack_2408 [31];
  fdb_config fStack_2310;
  undefined1 auStack_2218 [752];
  undefined8 auStack_1f28 [31];
  fdb_kvs_handle **ppfStack_1e30;
  fdb_kvs_handle *pfStack_1e28;
  fdb_kvs_handle *pfStack_1e20;
  fdb_kvs_config *pfStack_1e18;
  fdb_doc **ppfStack_1e10;
  fdb_kvs_handle *pfStack_1e08;
  fdb_kvs_handle *pfStack_1df0;
  fdb_kvs_handle *pfStack_1de8;
  fdb_doc *pfStack_1de0;
  fdb_kvs_handle *pfStack_1dd8;
  fdb_doc *apfStack_1dd0 [11];
  timeval tStack_1d78;
  fdb_kvs_config fStack_1d68;
  char acStack_1d50 [256];
  undefined1 auStack_1c50 [656];
  fdb_config fStack_19c0;
  fdb_kvs_handle **ppfStack_18c8;
  fdb_kvs_handle *pfStack_18c0;
  fdb_kvs_handle *pfStack_18b8;
  btree *pbStack_18b0;
  btree *pbStack_18a8;
  fdb_kvs_handle *pfStack_18a0;
  fdb_kvs_handle *pfStack_1890;
  fdb_kvs_handle *pfStack_1888;
  fdb_file_handle *pfStack_1880;
  fdb_kvs_handle *pfStack_1878;
  undefined1 auStack_1870 [40];
  undefined1 auStack_1848 [40];
  fdb_file_info fStack_1820;
  undefined1 auStack_17d8 [768];
  char acStack_14d8 [264];
  code *pcStack_13d0;
  fdb_kvs_handle *pfStack_13c8;
  fdb_kvs_handle *pfStack_13c0;
  char *pcStack_13b8;
  long lStack_13b0;
  fdb_kvs_handle *pfStack_13a8;
  fdb_snapshot_info_t *pfStack_1390;
  fdb_file_handle *pfStack_1388;
  char *pcStack_1380;
  int iStack_1374;
  undefined1 auStack_1370 [96];
  undefined1 auStack_1310 [32];
  timeval tStack_12f0;
  fdb_kvs_handle fStack_12e0;
  char acStack_1040 [256];
  fdb_config fStack_f40;
  size_t sStack_e48;
  size_t sStack_e40;
  fdb_doc **ppfStack_e38;
  char *pcStack_e30;
  code *pcStack_e28;
  code *pcStack_e20;
  fdb_file_handle *local_e08;
  fdb_snapshot_info_t *local_e00;
  uint64_t local_df8;
  uint local_dec;
  fdb_kvs_handle *local_de8 [4];
  fdb_kvs_config local_dc8;
  char local_db0 [8];
  timeval local_da8;
  char local_d98 [256];
  char local_c98 [256];
  char local_b98 [264];
  fdb_config local_a90;
  fdb_doc *local_998 [301];
  
  pcStack_e20 = (code *)0x10dca7;
  gettimeofday(&local_da8,(__timezone_ptr_t)0x0);
  pcStack_e20 = (code *)0x10dcac;
  memleak_start();
  pcStack_e20 = (code *)0x10dcbc;
  fdb_get_default_config();
  pcStack_e20 = (code *)0x10dcc6;
  fdb_get_default_kvs_config();
  local_a90.buffercache_size = 0;
  local_a90.wal_threshold = 0x32;
  local_a90.flags = 1;
  local_a90.compaction_threshold = '\0';
  local_a90.block_reusing_threshold = 0;
  pcStack_e20 = (code *)0x10dcf4;
  local_a90.multi_kv_instances = multi_kv;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_e20 = (code *)0x10dd08;
  fdb_open(&local_e08,"./compact_test1",&local_a90);
  local_dec = (uint)CONCAT71(in_register_00000039,multi_kv);
  if (local_dec == 0) {
    pcStack_e20 = (code *)0x10dd74;
    fdb_kvs_open_default(local_e08,local_de8,&local_dc8);
    sVar12 = 1;
  }
  else {
    ppfVar14 = local_de8;
    uVar22 = 0;
    do {
      pcStack_e20 = (code *)0x10dd39;
      sprintf(local_db0,"kv%d",uVar22 & 0xffffffff);
      pcStack_e20 = (code *)0x10dd4c;
      fdb_kvs_open(local_e08,ppfVar14,local_db0,&local_dc8);
      uVar22 = uVar22 + 1;
      ppfVar14 = ppfVar14 + 1;
    } while (uVar22 != 4);
    sVar12 = 4;
  }
  uVar22 = 0;
  do {
    pcStack_e20 = (code *)0x10dd98;
    sprintf(local_b98,"key%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10ddb1;
    sprintf(local_c98,"meta%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10ddca;
    sprintf(local_d98,"body%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10dddd;
    sVar5 = strlen(local_b98);
    pcStack_e20 = (code *)0x10ddf0;
    sVar6 = strlen(local_c98);
    pcStack_e20 = (code *)0x10de00;
    sVar7 = strlen(local_d98);
    pcStack_e20 = (code *)0x10de25;
    fdb_doc_create(local_998 + uVar22,local_b98,sVar5,local_c98,sVar6,local_d98,sVar7);
    sVar26 = 0;
    do {
      pcStack_e20 = (code *)0x10de36;
      fdb_set(local_de8[sVar26],local_998[uVar22]);
      sVar26 = sVar26 + 1;
    } while (sVar12 != sVar26);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 0x4b);
  pcStack_e20 = (code *)0x10de5a;
  fdb_commit(local_e08,'\x01');
  uVar22 = 0x4b;
  do {
    pcStack_e20 = (code *)0x10de7c;
    sprintf(local_b98,"key%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10de95;
    sprintf(local_c98,"meta%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10deae;
    sprintf(local_d98,"body%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10dec1;
    sVar5 = strlen(local_b98);
    pcStack_e20 = (code *)0x10ded4;
    sVar6 = strlen(local_c98);
    pcStack_e20 = (code *)0x10dee4;
    sVar7 = strlen(local_d98);
    pcStack_e20 = (code *)0x10df09;
    fdb_doc_create(local_998 + uVar22,local_b98,sVar5,local_c98,sVar6,local_d98,sVar7);
    sVar26 = 0;
    do {
      pcStack_e20 = (code *)0x10df1a;
      fdb_set(local_de8[sVar26],local_998[uVar22]);
      sVar26 = sVar26 + 1;
    } while (sVar12 != sVar26);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 0x96);
  lVar23 = 0;
  do {
    sVar26 = 0;
    do {
      pcStack_e20 = (code *)0x10df4a;
      fdb_set(local_de8[sVar26],local_998[lVar23]);
      sVar26 = sVar26 + 1;
    } while (sVar12 != sVar26);
    lVar23 = lVar23 + 1;
  } while (lVar23 != 0x4b);
  lVar23 = 0;
  do {
    sVar26 = 0;
    do {
      pcStack_e20 = (code *)0x10df73;
      fdb_set(local_de8[sVar26],local_998[lVar23]);
      sVar26 = sVar26 + 1;
    } while (sVar12 != sVar26);
    lVar23 = lVar23 + 1;
  } while (lVar23 != 0x4b);
  pcStack_e20 = (code *)0x10df90;
  fdb_commit(local_e08,'\0');
  uVar22 = 0x96;
  do {
    pcStack_e20 = (code *)0x10dfb2;
    sprintf(local_b98,"key%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10dfcb;
    sprintf(local_c98,"meta%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10dfe4;
    sprintf(local_d98,"body%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10dff7;
    sVar5 = strlen(local_b98);
    pcStack_e20 = (code *)0x10e00a;
    sVar6 = strlen(local_c98);
    pcStack_e20 = (code *)0x10e01a;
    sVar7 = strlen(local_d98);
    pcStack_e20 = (code *)0x10e03f;
    fdb_doc_create(local_998 + uVar22,local_b98,sVar5,local_c98,sVar6,local_d98,sVar7);
    sVar26 = 0;
    do {
      pcStack_e20 = (code *)0x10e050;
      fdb_set(local_de8[sVar26],local_998[uVar22]);
      sVar26 = sVar26 + 1;
    } while (sVar12 != sVar26);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 0xe1);
  pcStack_e20 = (code *)0x10e077;
  fdb_commit(local_e08,'\x01');
  uVar22 = 0xe1;
  do {
    pcStack_e20 = (code *)0x10e099;
    sprintf(local_b98,"key%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10e0b2;
    sprintf(local_c98,"meta%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10e0cb;
    sprintf(local_d98,"body%d",uVar22 & 0xffffffff);
    ppfVar27 = local_998 + uVar22;
    pcStack_e20 = (code *)0x10e0de;
    sVar5 = strlen(local_b98);
    pcStack_e20 = (code *)0x10e0f1;
    sVar6 = strlen(local_c98);
    pcStack_e20 = (code *)0x10e101;
    sVar7 = strlen(local_d98);
    pcStack_e20 = (code *)0x10e126;
    fdb_doc_create(ppfVar27,local_b98,sVar5,local_c98,sVar6,local_d98,sVar7);
    sVar26 = 0;
    do {
      pcStack_e20 = (code *)0x10e137;
      fdb_set(local_de8[sVar26],*ppfVar27);
      sVar26 = sVar26 + 1;
    } while (sVar12 != sVar26);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 300);
  sVar26 = 0;
  pcStack_e20 = (code *)0x10e15e;
  fdb_commit(local_e08,'\0');
  do {
    pfVar10 = local_de8[sVar26];
    pcStack_e20 = (code *)0x10e17c;
    fVar3 = fdb_set_log_callback(pfVar10,logCallbackFunc,"estimate_space_upto_test");
    iVar4 = (int)pfVar10;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_e20 = (code *)0x10e2f3;
      estimate_space_upto_test();
      goto LAB_0010e2f3;
    }
    sVar26 = sVar26 + 1;
  } while (sVar12 != sVar26);
  pcStack_e20 = (code *)0x10e1a0;
  pfVar19 = local_e08;
  fVar3 = fdb_get_all_snap_markers(local_e08,&local_e00,&local_df8);
  iVar4 = (int)pfVar19;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    sVar5 = (size_t)local_dec;
    cVar17 = (char)local_dec;
    uVar9 = local_df8;
    if (cVar17 != '\0') {
      if (local_df8 != 8) {
        pcStack_e20 = (code *)0x10e1c6;
        estimate_space_upto_test();
      }
      pcStack_e20 = (code *)0x10e1d9;
      sVar12 = fdb_estimate_space_used_from(local_e08,local_e00[1].marker);
      pcStack_e20 = (code *)0x10e1ef;
      sVar8 = fdb_estimate_space_used_from(local_e08,local_e00[2].marker);
      if (sVar8 <= sVar12) {
        pcStack_e20 = (code *)0x10e1f9;
        estimate_space_upto_test();
        uVar9 = extraout_RAX;
        goto LAB_0010e1f9;
      }
LAB_0010e23b:
      pcStack_e20 = (code *)0x10e24a;
      fVar3 = fdb_free_snap_markers(local_e00,local_df8);
      iVar4 = (int)local_e00;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pcStack_e20 = (code *)0x10e25c;
        fdb_close(local_e08);
        lVar23 = 0;
        do {
          pcStack_e20 = (code *)0x10e26b;
          fdb_doc_free(local_998[lVar23]);
          lVar23 = lVar23 + 1;
        } while (lVar23 != 300);
        pcStack_e20 = (code *)0x10e27c;
        fdb_shutdown();
        pcStack_e20 = (code *)0x10e281;
        memleak_end();
        pcVar11 = "single kv mode:";
        if (cVar17 != '\0') {
          pcVar11 = "multiple kv mode:";
        }
        pcStack_e20 = (code *)0x10e2af;
        sprintf(local_d98,"estimate space upto marker in file test %s",pcVar11);
        pcVar11 = "%s PASSED\n";
        if (estimate_space_upto_test(bool)::__test_pass != '\0') {
          pcVar11 = "%s FAILED\n";
        }
        pcStack_e20 = (code *)0x10e2dc;
        fprintf(_stderr,pcVar11,local_d98);
        return;
      }
      goto LAB_0010e2f8;
    }
LAB_0010e1f9:
    if (uVar9 != 4) {
      pcStack_e20 = (code *)0x10e209;
      estimate_space_upto_test();
    }
    pcStack_e20 = (code *)0x10e21c;
    sVar12 = fdb_estimate_space_used_from(local_e08,local_e00[1].marker);
    pcStack_e20 = (code *)0x10e232;
    pfVar19 = local_e08;
    sVar8 = fdb_estimate_space_used_from(local_e08,local_e00[2].marker);
    iVar4 = (int)pfVar19;
    if (sVar12 < sVar8) goto LAB_0010e23b;
  }
  else {
LAB_0010e2f3:
    pcStack_e20 = (code *)0x10e2f8;
    estimate_space_upto_test();
LAB_0010e2f8:
    pcStack_e20 = (code *)0x10e2fd;
    estimate_space_upto_test();
  }
  pcStack_e20 = compact_upto_test;
  estimate_space_upto_test();
  pcStack_e28 = logCallbackFunc;
  pcStack_e30 = "estimate_space_upto_test";
  pfStack_13a8 = (fdb_kvs_handle *)0x10e327;
  sStack_e48 = sVar12;
  sStack_e40 = sVar26;
  ppfStack_e38 = ppfVar27;
  pcStack_e20 = (code *)sVar5;
  gettimeofday(&tStack_12f0,(__timezone_ptr_t)0x0);
  pfStack_13a8 = (fdb_kvs_handle *)0x10e32c;
  memleak_start();
  pfStack_13a8 = (fdb_kvs_handle *)0x10e33c;
  fdb_get_default_config();
  pfStack_13a8 = (fdb_kvs_handle *)0x10e346;
  fdb_get_default_kvs_config();
  fStack_f40.buffercache_size = 0;
  fStack_f40.wal_threshold = 0x400;
  fStack_f40.flags = 1;
  fStack_f40.compaction_threshold = '\0';
  fStack_f40.block_reusing_threshold = 0;
  pfStack_13a8 = (fdb_kvs_handle *)0x10e374;
  fStack_f40.multi_kv_instances = (bool)(char)iVar4;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_13a8 = (fdb_kvs_handle *)0x10e388;
  fdb_open(&pfStack_1388,"./compact_test1",&fStack_f40);
  iStack_1374 = iVar4;
  if (iVar4 == 0) {
    pfStack_13a8 = (fdb_kvs_handle *)0x10e3f4;
    fdb_kvs_open_default
              (pfStack_1388,(fdb_kvs_handle **)(auStack_1370 + 0x20),
               (fdb_kvs_config *)(auStack_1370 + 0x48));
    uVar20 = 1;
  }
  else {
    ppfVar14 = (fdb_kvs_handle **)(auStack_1370 + 0x20);
    uVar22 = 0;
    do {
      pfStack_13a8 = (fdb_kvs_handle *)0x10e3b9;
      sprintf(auStack_1370,"kv%d",uVar22 & 0xffffffff);
      pfStack_13a8 = (fdb_kvs_handle *)0x10e3cc;
      fdb_kvs_open(pfStack_1388,ppfVar14,auStack_1370,(fdb_kvs_config *)(auStack_1370 + 0x48));
      uVar22 = uVar22 + 1;
      ppfVar14 = ppfVar14 + 1;
    } while (uVar22 != 4);
    uVar20 = 4;
  }
  pfVar10 = (fdb_kvs_handle *)(ulong)uVar20;
  uVar22 = 0;
  do {
    pfStack_13a8 = (fdb_kvs_handle *)0x10e41a;
    sprintf((char *)&fStack_12e0.kv_info_offset,"key%d",uVar22 & 0xffffffff);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e433;
    sprintf((char *)&fStack_12e0.config.compaction_minimum_filesize,"meta%d",uVar22 & 0xffffffff);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e44c;
    sprintf(acStack_1040,"body%d",uVar22 & 0xffffffff);
    pbVar21 = &fStack_12e0.kvs_config.create_if_missing + uVar22 * 8;
    pfStack_13a8 = (fdb_kvs_handle *)0x10e45f;
    sVar5 = strlen((char *)&fStack_12e0.kv_info_offset);
    puVar1 = &fStack_12e0.config.compaction_minimum_filesize;
    pfStack_13a8 = (fdb_kvs_handle *)0x10e472;
    sVar6 = strlen((char *)puVar1);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e482;
    sVar7 = strlen(acStack_1040);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e4a7;
    fdb_doc_create((fdb_doc **)pbVar21,&fStack_12e0.kv_info_offset,sVar5,puVar1,sVar6,acStack_1040,
                   sVar7);
    lVar23 = 0;
    do {
      pfStack_13a8 = (fdb_kvs_handle *)0x10e4b8;
      fdb_set(*(fdb_kvs_handle **)(auStack_1370 + lVar23 * 8 + 0x20),*(fdb_doc **)pbVar21);
      lVar23 = lVar23 + 1;
    } while (pfVar10 != (fdb_kvs_handle *)lVar23);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 5);
  pfStack_13a8 = (fdb_kvs_handle *)0x10e4dc;
  fdb_commit(pfStack_1388,'\x01');
  uVar22 = 5;
  do {
    pfStack_13a8 = (fdb_kvs_handle *)0x10e4fe;
    sprintf((char *)&fStack_12e0.kv_info_offset,"key%d",uVar22 & 0xffffffff);
    puVar1 = &fStack_12e0.config.compaction_minimum_filesize;
    pfStack_13a8 = (fdb_kvs_handle *)0x10e51a;
    sprintf((char *)puVar1,"meta%d",uVar22 & 0xffffffff);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e536;
    sprintf(acStack_1040,"body%d",uVar22 & 0xffffffff);
    pbVar21 = &fStack_12e0.kvs_config.create_if_missing + uVar22 * 8;
    pfStack_13a8 = (fdb_kvs_handle *)0x10e549;
    sVar5 = strlen((char *)&fStack_12e0.kv_info_offset);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e554;
    sVar6 = strlen((char *)puVar1);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e55f;
    sVar7 = strlen(acStack_1040);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e584;
    fdb_doc_create((fdb_doc **)pbVar21,&fStack_12e0.kv_info_offset,sVar5,
                   &fStack_12e0.config.compaction_minimum_filesize,sVar6,acStack_1040,sVar7);
    lVar23 = 0;
    do {
      pfStack_13a8 = (fdb_kvs_handle *)0x10e594;
      fdb_set(*(fdb_kvs_handle **)(auStack_1370 + lVar23 * 8 + 0x20),*(fdb_doc **)pbVar21);
      lVar23 = lVar23 + 1;
    } while (pfVar10 != (fdb_kvs_handle *)lVar23);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 10);
  pfStack_13a8 = (fdb_kvs_handle *)0x10e5b5;
  fdb_commit(pfStack_1388,'\0');
  uVar22 = 10;
  do {
    pfStack_13a8 = (fdb_kvs_handle *)0x10e5d7;
    sprintf((char *)&fStack_12e0.kv_info_offset,"key%d",uVar22 & 0xffffffff);
    puVar1 = &fStack_12e0.config.compaction_minimum_filesize;
    pfStack_13a8 = (fdb_kvs_handle *)0x10e5f3;
    sprintf((char *)puVar1,"meta%d",uVar22 & 0xffffffff);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e60f;
    sprintf(acStack_1040,"body%d",uVar22 & 0xffffffff);
    pbVar21 = &fStack_12e0.kvs_config.create_if_missing + uVar22 * 8;
    pfStack_13a8 = (fdb_kvs_handle *)0x10e622;
    sVar5 = strlen((char *)&fStack_12e0.kv_info_offset);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e62d;
    sVar6 = strlen((char *)puVar1);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e638;
    sVar7 = strlen(acStack_1040);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e65d;
    fdb_doc_create((fdb_doc **)pbVar21,&fStack_12e0.kv_info_offset,sVar5,
                   &fStack_12e0.config.compaction_minimum_filesize,sVar6,acStack_1040,sVar7);
    lVar23 = 0;
    do {
      pfStack_13a8 = (fdb_kvs_handle *)0x10e66d;
      fdb_set(*(fdb_kvs_handle **)(auStack_1370 + lVar23 * 8 + 0x20),*(fdb_doc **)pbVar21);
      lVar23 = lVar23 + 1;
    } while (pfVar10 != (fdb_kvs_handle *)lVar23);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 0xf);
  pfStack_13a8 = (fdb_kvs_handle *)0x10e691;
  fdb_commit(pfStack_1388,'\x01');
  uVar22 = 0xf;
  do {
    pfStack_13a8 = (fdb_kvs_handle *)0x10e6b3;
    sprintf((char *)&fStack_12e0.kv_info_offset,"key%d",uVar22 & 0xffffffff);
    puVar1 = &fStack_12e0.config.compaction_minimum_filesize;
    pfStack_13a8 = (fdb_kvs_handle *)0x10e6cf;
    sprintf((char *)puVar1,"meta%d",uVar22 & 0xffffffff);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e6eb;
    sprintf(acStack_1040,"body%d",uVar22 & 0xffffffff);
    doc = (fdb_kvs_handle *)(&fStack_12e0.kvs_config.create_if_missing + uVar22 * 8);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e6fe;
    sVar5 = strlen((char *)&fStack_12e0.kv_info_offset);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e709;
    handle = (fdb_kvs_handle *)strlen((char *)puVar1);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e714;
    sVar6 = strlen(acStack_1040);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e739;
    fdb_doc_create((fdb_doc **)doc,&fStack_12e0.kv_info_offset,sVar5,
                   &fStack_12e0.config.compaction_minimum_filesize,(size_t)handle,acStack_1040,sVar6
                  );
    lVar23 = 0;
    do {
      pfStack_13a8 = (fdb_kvs_handle *)0x10e749;
      fdb_set(*(fdb_kvs_handle **)(auStack_1370 + lVar23 * 8 + 0x20),*(fdb_doc **)&doc->kvs_config);
      lVar23 = lVar23 + 1;
    } while (pfVar10 != (fdb_kvs_handle *)lVar23);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 0x14);
  lVar23 = 0;
  pfStack_13a8 = (fdb_kvs_handle *)0x10e76d;
  fdb_commit(pfStack_1388,'\0');
  __s = logCallbackFunc;
  pcVar11 = "compact_upto_test";
  do {
    pfStack_13a8 = (fdb_kvs_handle *)0x10e78b;
    fVar3 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(auStack_1370 + lVar23 * 8 + 0x20),logCallbackFunc,
                       "compact_upto_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eacf;
    lVar23 = lVar23 + 1;
  } while (pfVar10 != (fdb_kvs_handle *)lVar23);
  pfStack_13a8 = (fdb_kvs_handle *)0x10e7af;
  fVar3 = fdb_get_all_snap_markers(pfStack_1388,&pfStack_1390,(uint64_t *)&pcStack_1380);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010ead4;
  if ((char)iStack_1374 == '\0') {
    if (pcStack_1380 != (char *)0x4) {
      pfStack_13a8 = (fdb_kvs_handle *)0x10e8c9;
      compact_upto_test();
    }
    if (pcStack_1380 != (char *)0x0) {
      lVar23 = 0x1400000000;
      handle = (fdb_kvs_handle *)0x0;
      doc = (fdb_kvs_handle *)0xfffffffb00000000;
      pcVar11 = (char *)0x0;
      do {
        if (*(long *)((long)&pfStack_1390->num_kvs_markers + (long)handle) != 1) {
          pfStack_13a8 = (fdb_kvs_handle *)0x10eab6;
          compact_upto_test();
        }
        if (*(long *)(*(long *)((long)&pfStack_1390->kvs_markers + (long)handle) + 8) !=
            lVar23 >> 0x20) {
          pfStack_13a8 = (fdb_kvs_handle *)0x10eac3;
          compact_upto_test();
        }
        pcVar11 = pcVar11 + 1;
        lVar23 = lVar23 + -0x500000000;
        handle = (fdb_kvs_handle *)((long)handle + 0x18);
      } while (pcVar11 < pcStack_1380);
    }
    __s = (code *)auStack_1310;
    pfStack_13a8 = (fdb_kvs_handle *)0x10e8f3;
    sprintf((char *)__s,"compact_test_compact%d",1);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e909;
    fVar3 = fdb_compact_upto(pfStack_1388,(char *)__s,pfStack_1390[1].marker);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_13a8 = (fdb_kvs_handle *)0x10e92d;
      fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1370._32_8_,
                                (fdb_kvs_handle **)(auStack_1370 + 0x18),
                                (pfStack_1390[1].kvs_markers)->seqnum);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_13a8 = (fdb_kvs_handle *)0x10e936;
        compact_upto_test();
        goto LAB_0010e936;
      }
LAB_0010e996:
      __s = (code *)auStack_1310;
      pfStack_13a8 = (fdb_kvs_handle *)0x10e9a0;
      fdb_kvs_close((fdb_kvs_handle *)auStack_1370._24_8_);
      pfStack_13a8 = (fdb_kvs_handle *)0x10e9af;
      fVar3 = fdb_free_snap_markers(pfStack_1390,(uint64_t)pcStack_1380);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pfStack_13a8 = (fdb_kvs_handle *)0x10e9c1;
        fdb_close(pfStack_1388);
        lVar23 = 0;
        do {
          pfStack_13a8 = (fdb_kvs_handle *)0x10e9d0;
          fdb_doc_free(*(fdb_doc **)(&fStack_12e0.kvs_config.create_if_missing + lVar23 * 8));
          lVar23 = lVar23 + 1;
        } while (lVar23 != 0x14);
        pfStack_13a8 = (fdb_kvs_handle *)0x10e9de;
        fdb_shutdown();
        pfStack_13a8 = (fdb_kvs_handle *)0x10e9e3;
        memleak_end();
        pcVar11 = "single kv mode:";
        if ((char)iStack_1374 != '\0') {
          pcVar11 = "multiple kv mode:";
        }
        pfStack_13a8 = (fdb_kvs_handle *)0x10ea13;
        sprintf(acStack_1040,"compact upto marker in file test %s",pcVar11);
        pcVar11 = "%s PASSED\n";
        if (compact_upto_test(bool)::__test_pass != '\0') {
          pcVar11 = "%s FAILED\n";
        }
        pfStack_13a8 = (fdb_kvs_handle *)0x10ea40;
        fprintf(_stderr,pcVar11,acStack_1040);
        return;
      }
      goto LAB_0010ead9;
    }
    goto LAB_0010eade;
  }
  if (pcStack_1380 != (char *)0x8) {
    pfStack_13a8 = (fdb_kvs_handle *)0x10e7d7;
    compact_upto_test();
  }
  auStack_1370._8_8_ = ZEXT48(uVar20 + 1);
  handle = (fdb_kvs_handle *)auStack_1370;
  pvVar13 = (void *)0x0;
  do {
    pcVar11 = (char *)((long)pvVar13 * 3);
    if ((fdb_custom_cmp_variable)pfStack_1390[(long)pvVar13].num_kvs_markers !=
        (fdb_custom_cmp_variable)auStack_1370._8_8_) {
      pfStack_13a8 = (fdb_kvs_handle *)0x10e8b4;
      compact_upto_test();
    }
    __s = (code *)((long)pvVar13 * -5 + 0x14);
    lVar23 = 8;
    doc = (fdb_kvs_handle *)0x0;
    auStack_1370._16_8_ = pvVar13;
    do {
      if (*(code **)(lVar23 + (long)&(pfStack_1390[(long)pvVar13].kvs_markers)->kv_store_name) !=
          __s) {
        pfStack_13a8 = (fdb_kvs_handle *)0x10e88a;
        compact_upto_test();
      }
      pfStack_13a8 = (fdb_kvs_handle *)0x10e83d;
      sprintf((char *)handle,"kv%d",(ulong)doc & 0xffffffff);
      psVar2 = *(short **)((long)&pfStack_1390[(long)pvVar13].kvs_markers[-1].seqnum + lVar23);
      if ((char)psVar2[1] != auStack_1370[2] || *psVar2 != auStack_1370._0_2_) {
        pfStack_13a8 = (fdb_kvs_handle *)0x10eacf;
        compact_upto_test();
        goto LAB_0010eacf;
      }
      doc = (fdb_kvs_handle *)&(doc->kvs_config).field_0x1;
      lVar23 = lVar23 + 0x10;
    } while (pfVar10 != doc);
    pvVar13 = (void *)(auStack_1370._16_8_ + 1);
  } while ((fdb_kvs_handle *)pvVar13 != pfVar10);
LAB_0010e936:
  __s = (code *)auStack_1310;
  pfStack_13a8 = (fdb_kvs_handle *)0x10e954;
  sprintf((char *)__s,"compact_test_compact%d",1);
  pfStack_13a8 = (fdb_kvs_handle *)0x10e96a;
  fVar3 = fdb_compact_upto(pfStack_1388,(char *)__s,pfStack_1390[1].marker);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eae3;
  pfStack_13a8 = (fdb_kvs_handle *)0x10e98e;
  fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1370._40_8_,
                            (fdb_kvs_handle **)(auStack_1370 + 0x18),
                            pfStack_1390[1].kvs_markers[1].seqnum);
  if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0010e996;
LAB_0010eae8:
  pfStack_13a8 = (fdb_kvs_handle *)auto_recover_compact_ok_test;
  compact_upto_test();
  pfStack_18a0 = (fdb_kvs_handle *)0x10eb0a;
  pcStack_13d0 = __s;
  pfStack_13c8 = handle;
  pfStack_13c0 = doc;
  pcStack_13b8 = pcVar11;
  lStack_13b0 = lVar23;
  pfStack_13a8 = pfVar10;
  gettimeofday((timeval *)(auStack_1848 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_18a0 = (fdb_kvs_handle *)0x10eb0f;
  memleak_start();
  pfStack_18a0 = (fdb_kvs_handle *)0x10eb1b;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_18a0 = (fdb_kvs_handle *)0x10eb2b;
  fdb_get_default_config();
  config_00 = (btree *)auStack_1848;
  pfStack_18a0 = (fdb_kvs_handle *)0x10eb38;
  fdb_get_default_kvs_config();
  auStack_17d8[0x110] = '\0';
  auStack_17d8[0x111] = '\0';
  auStack_17d8[0x112] = '\0';
  auStack_17d8[0x113] = '\x01';
  auStack_17d8[0x114] = '\0';
  auStack_17d8[0x115] = '\0';
  auStack_17d8[0x116] = '\0';
  auStack_17d8[0x117] = '\0';
  auStack_17d8[0x118] = '\0';
  auStack_17d8[0x119] = '\x04';
  auStack_17d8[0x11a] = '\0';
  auStack_17d8[0x11b] = '\0';
  auStack_17d8[0x11c] = '\0';
  auStack_17d8[0x11d] = '\0';
  auStack_17d8[0x11e] = '\0';
  auStack_17d8[0x11f] = '\0';
  auStack_17d8._300_4_ = 1;
  auStack_17d8[0x137] = 0;
  ptr_fhandle_00 = (btree *)&pfStack_1880;
  pfStack_18a0 = (fdb_kvs_handle *)0x10eb6a;
  fdb_open((fdb_file_handle **)ptr_fhandle_00,"./compact_test1",(fdb_config *)(auStack_17d8 + 0x108)
          );
  ppfVar14 = &pfStack_1888;
  pfStack_18a0 = (fdb_kvs_handle *)0x10eb7d;
  fdb_kvs_open_default(pfStack_1880,ppfVar14,(fdb_kvs_config *)config_00);
  pfStack_18a0 = (fdb_kvs_handle *)0x10eb93;
  fVar3 = fdb_set_log_callback(pfStack_1888,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_18a0 = (fdb_kvs_handle *)0x10ebb7;
    fdb_open((fdb_file_handle **)auStack_1870,"./compact_test1",(fdb_config *)(auStack_17d8 + 0x108)
            );
    ppfVar14 = &pfStack_1878;
    pfStack_18a0 = (fdb_kvs_handle *)0x10ebcc;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_1870._0_8_,ppfVar14,(fdb_kvs_config *)auStack_1848);
    pfStack_18a0 = (fdb_kvs_handle *)0x10ebe2;
    fVar3 = fdb_set_log_callback(pfStack_1878,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010efd1;
    lVar23 = 0;
    uVar22 = 0;
    do {
      pfStack_18a0 = (fdb_kvs_handle *)0x10ec0a;
      sprintf(acStack_14d8,"key%d",uVar22 & 0xffffffff);
      pfStack_18a0 = (fdb_kvs_handle *)0x10ec22;
      sprintf(auStack_17d8 + 0x200,"meta%d",uVar22 & 0xffffffff);
      pfStack_18a0 = (fdb_kvs_handle *)0x10ec3a;
      sprintf(auStack_17d8,"body%d",uVar22 & 0xffffffff);
      pfStack_18a0 = (fdb_kvs_handle *)0x10ec4a;
      sVar5 = strlen(acStack_14d8);
      pfStack_18a0 = (fdb_kvs_handle *)0x10ec5d;
      sVar6 = strlen(auStack_17d8 + 0x200);
      pfStack_18a0 = (fdb_kvs_handle *)0x10ec6d;
      sVar7 = strlen(auStack_17d8);
      pfStack_18a0 = (fdb_kvs_handle *)0x10ec92;
      fdb_doc_create((fdb_doc **)(auStack_1870 + lVar23 + 8),acStack_14d8,sVar5,auStack_17d8 + 0x200
                     ,sVar6,auStack_17d8,sVar7);
      pfStack_18a0 = (fdb_kvs_handle *)0x10eca1;
      fdb_set(pfStack_1888,*(fdb_doc **)(auStack_1870 + uVar22 * 8 + 8));
      uVar22 = uVar22 + 1;
      lVar23 = lVar23 + 8;
    } while (uVar22 == 1);
    pfStack_18a0 = (fdb_kvs_handle *)0x10ece2;
    fdb_doc_create((fdb_doc **)&pfStack_1890,*(void **)(auStack_1870._16_8_ + 0x20),
                   *(size_t *)auStack_1870._16_8_,*(void **)(auStack_1870._16_8_ + 0x38),
                   *(size_t *)(auStack_1870._16_8_ + 8),(void *)0x0,0);
    *(bool *)&pfStack_1890->file = true;
    pfStack_18a0 = (fdb_kvs_handle *)0x10ecf3;
    fdb_set(pfStack_1888,(fdb_doc *)pfStack_1890);
    pfStack_18a0 = (fdb_kvs_handle *)0x10ecfb;
    fdb_doc_free((fdb_doc *)pfStack_1890);
    pfStack_18a0 = (fdb_kvs_handle *)0x10ed0a;
    fdb_commit(pfStack_1880,'\x01');
    pfStack_18a0 = (fdb_kvs_handle *)0x10ed1b;
    fdb_compact(pfStack_1880,"./compact_test2");
    pfStack_18a0 = (fdb_kvs_handle *)0x10ed27;
    system("cp  compact_test1 compact_test11 > errorlog.txt");
    pfStack_18a0 = (fdb_kvs_handle *)0x10ed45;
    sprintf(acStack_14d8,"key%d",2);
    ptr_fhandle_00 = (btree *)(auStack_17d8 + 0x200);
    pfStack_18a0 = (fdb_kvs_handle *)0x10ed63;
    sprintf((char *)ptr_fhandle_00,"meta%d",2);
    handle = (fdb_kvs_handle *)auStack_17d8;
    pfStack_18a0 = (fdb_kvs_handle *)0x10ed81;
    sprintf((char *)handle,"body%d",2);
    pfStack_18a0 = (fdb_kvs_handle *)0x10ed89;
    doc = (fdb_kvs_handle *)strlen(acStack_14d8);
    pfStack_18a0 = (fdb_kvs_handle *)0x10ed94;
    pfVar10 = (fdb_kvs_handle *)strlen((char *)ptr_fhandle_00);
    pfStack_18a0 = (fdb_kvs_handle *)0x10ed9f;
    sVar5 = strlen((char *)handle);
    pfStack_18a0 = (fdb_kvs_handle *)0x10edba;
    fdb_doc_create((fdb_doc **)(auStack_1870 + 0x18),acStack_14d8,(size_t)doc,ptr_fhandle_00,
                   (size_t)pfVar10,handle,sVar5);
    pfStack_18a0 = (fdb_kvs_handle *)0x10edc7;
    fdb_set(pfStack_1888,(fdb_doc *)auStack_1870._24_8_);
    pfStack_18a0 = (fdb_kvs_handle *)0x10edd6;
    fdb_commit(pfStack_1880,'\x01');
    pfStack_18a0 = (fdb_kvs_handle *)0x10ede0;
    fdb_kvs_close(pfStack_1888);
    ppfVar14 = &pfStack_1878;
    pfStack_18a0 = (fdb_kvs_handle *)0x10eded;
    fdb_kvs_close(pfStack_1878);
    pfStack_18a0 = (fdb_kvs_handle *)0x10edf7;
    fdb_close(pfStack_1880);
    config_00 = (btree *)auStack_1870;
    pfStack_18a0 = (fdb_kvs_handle *)0x10ee04;
    fdb_close((fdb_file_handle *)auStack_1870._0_8_);
    pfStack_18a0 = (fdb_kvs_handle *)0x10ee10;
    system("mv  compact_test11 compact_test1 > errorlog.txt");
    pfStack_18a0 = (fdb_kvs_handle *)0x10ee27;
    fdb_open((fdb_file_handle **)config_00,"./compact_test1",(fdb_config *)(auStack_17d8 + 0x108));
    pfStack_18a0 = (fdb_kvs_handle *)0x10ee37;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_1870._0_8_,ppfVar14,(fdb_kvs_config *)auStack_1848);
    pfStack_18a0 = (fdb_kvs_handle *)0x10ee4d;
    fVar3 = fdb_set_log_callback(pfStack_1878,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      handle = (fdb_kvs_handle *)0x0;
      ppfVar14 = &pfStack_1890;
      while( true ) {
        pfStack_18a0 = (fdb_kvs_handle *)0x10ee81;
        fdb_doc_create((fdb_doc **)ppfVar14,
                       (void *)(*(size_t **)(auStack_1870 + (long)handle * 8 + 8))[4],
                       **(size_t **)(auStack_1870 + (long)handle * 8 + 8),(void *)0x0,0,(void *)0x0,
                       0);
        pfStack_18a0 = (fdb_kvs_handle *)0x10ee90;
        fVar3 = fdb_get(pfStack_1878,(fdb_doc *)pfStack_1890);
        pfVar15 = pfStack_1890;
        if (handle != (fdb_kvs_handle *)0x1) break;
        pfVar15 = doc;
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010efc7;
LAB_0010eef0:
        pfStack_18a0 = (fdb_kvs_handle *)0x10eefa;
        fdb_doc_free((fdb_doc *)pfStack_1890);
        handle = (fdb_kvs_handle *)&(handle->kvs_config).field_0x1;
        doc = pfVar15;
        if (handle == (fdb_kvs_handle *)0x3) {
          pfStack_18a0 = (fdb_kvs_handle *)0x10ef19;
          fdb_get_file_info((fdb_file_handle *)auStack_1870._0_8_,&fStack_1820);
          pfStack_18a0 = (fdb_kvs_handle *)0x10ef28;
          iVar4 = strcmp("./compact_test2",fStack_1820.filename);
          if (iVar4 != 0) {
            pfStack_18a0 = (fdb_kvs_handle *)0x10ef36;
            auto_recover_compact_ok_test();
          }
          pfStack_18a0 = (fdb_kvs_handle *)0x10ef40;
          fdb_kvs_close(pfStack_1878);
          pfStack_18a0 = (fdb_kvs_handle *)0x10ef4a;
          fdb_close((fdb_file_handle *)auStack_1870._0_8_);
          lVar23 = 0;
          do {
            pfStack_18a0 = (fdb_kvs_handle *)0x10ef56;
            fdb_doc_free(*(fdb_doc **)(auStack_1870 + lVar23 * 8 + 8));
            lVar23 = lVar23 + 1;
          } while (lVar23 != 3);
          pfStack_18a0 = (fdb_kvs_handle *)0x10ef64;
          fdb_shutdown();
          pfStack_18a0 = (fdb_kvs_handle *)0x10ef69;
          memleak_end();
          pcVar11 = "%s PASSED\n";
          if (auto_recover_compact_ok_test()::__test_pass != '\0') {
            pcVar11 = "%s FAILED\n";
          }
          pfStack_18a0 = (fdb_kvs_handle *)0x10ef9a;
          fprintf(_stderr,pcVar11,"auto recovery after compaction test");
          return;
        }
      }
      if (fVar3 == FDB_RESULT_SUCCESS) {
        config_00 = pfStack_1890->staletree;
        pfVar10 = *(fdb_kvs_handle **)(auStack_1870 + (long)handle * 8 + 8);
        ptr_fhandle_00 = pfVar10->staletree;
        pfStack_18a0 = (fdb_kvs_handle *)0x10eec9;
        iVar4 = bcmp(config_00,ptr_fhandle_00,(size_t)(pfStack_1890->kvs_config).custom_cmp);
        if (iVar4 == 0) {
          config_00 = (pfVar15->field_6).seqtree;
          ptr_fhandle_00 = (pfVar10->field_6).seqtree;
          pfStack_18a0 = (fdb_kvs_handle *)0x10eee8;
          iVar4 = bcmp(config_00,ptr_fhandle_00,(size_t)(pfVar15->kvs_config).custom_cmp_param);
          if (iVar4 == 0) goto LAB_0010eef0;
          pfStack_18a0 = (fdb_kvs_handle *)0x10efb7;
          auto_recover_compact_ok_test();
          doc = pfVar15;
          goto LAB_0010efb7;
        }
      }
      else {
LAB_0010efb7:
        pfVar15 = doc;
        pfStack_18a0 = (fdb_kvs_handle *)0x10efbc;
        auto_recover_compact_ok_test();
      }
      pfStack_18a0 = (fdb_kvs_handle *)0x10efc7;
      auto_recover_compact_ok_test();
      doc = pfVar15;
LAB_0010efc7:
      pfStack_18a0 = (fdb_kvs_handle *)0x10efcc;
      auto_recover_compact_ok_test();
      goto LAB_0010efcc;
    }
  }
  else {
LAB_0010efcc:
    pfStack_18a0 = (fdb_kvs_handle *)0x10efd1;
    auto_recover_compact_ok_test();
LAB_0010efd1:
    pfStack_18a0 = (fdb_kvs_handle *)0x10efd6;
    auto_recover_compact_ok_test();
  }
  pfStack_18a0 = (fdb_kvs_handle *)unlink_after_compaction_test;
  auto_recover_compact_ok_test();
  pfStack_1e08 = (fdb_kvs_handle *)0x10effb;
  ppfStack_18c8 = ppfVar14;
  pfStack_18c0 = handle;
  pfStack_18b8 = doc;
  pbStack_18b0 = config_00;
  pbStack_18a8 = ptr_fhandle_00;
  pfStack_18a0 = pfVar10;
  gettimeofday(&tStack_1d78,(__timezone_ptr_t)0x0);
  pfStack_1e08 = (fdb_kvs_handle *)0x10f000;
  memleak_start();
  pfStack_1e08 = (fdb_kvs_handle *)0x10f00c;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_1e08 = (fdb_kvs_handle *)0x10f01c;
  fdb_get_default_config();
  config = &fStack_1d68;
  pfStack_1e08 = (fdb_kvs_handle *)0x10f02c;
  fdb_get_default_kvs_config();
  fStack_19c0.buffercache_size = 0x1000000;
  fStack_19c0.wal_threshold = 0x400;
  fStack_19c0.flags = 1;
  fStack_19c0.compaction_threshold = '\0';
  ppfVar27 = &pfStack_1de0;
  pfStack_1e08 = (fdb_kvs_handle *)0x10f05e;
  fdb_open((fdb_file_handle **)ppfVar27,"./compact_test1",&fStack_19c0);
  ppfVar14 = &pfStack_1de8;
  pfStack_1e08 = (fdb_kvs_handle *)0x10f071;
  fdb_kvs_open_default((fdb_file_handle *)pfStack_1de0,ppfVar14,config);
  pfStack_1e08 = (fdb_kvs_handle *)0x10f087;
  fVar3 = fdb_set_log_callback(pfStack_1de8,logCallbackFunc,"unlink_after_compaction_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    handle = (fdb_kvs_handle *)0x0;
    uVar22 = 0;
    do {
      pfStack_1e08 = (fdb_kvs_handle *)0x10f0af;
      sprintf(auStack_1c50 + 0x100,"key%d",uVar22 & 0xffffffff);
      pfStack_1e08 = (fdb_kvs_handle *)0x10f0c7;
      sprintf(auStack_1c50,"meta%d",uVar22 & 0xffffffff);
      pfStack_1e08 = (fdb_kvs_handle *)0x10f0df;
      sprintf(acStack_1d50,"body%d",uVar22 & 0xffffffff);
      ppfVar27 = (fdb_doc **)((long)apfStack_1dd0 + (long)handle);
      pfStack_1e08 = (fdb_kvs_handle *)0x10f0ef;
      doc = (fdb_kvs_handle *)strlen(auStack_1c50 + 0x100);
      pfVar10 = (fdb_kvs_handle *)auStack_1c50;
      pfStack_1e08 = (fdb_kvs_handle *)0x10f102;
      config = (fdb_kvs_config *)strlen((char *)pfVar10);
      pfStack_1e08 = (fdb_kvs_handle *)0x10f112;
      sVar5 = strlen(acStack_1d50);
      pfStack_1e08 = (fdb_kvs_handle *)0x10f137;
      fdb_doc_create(ppfVar27,auStack_1c50 + 0x100,(size_t)doc,pfVar10,(size_t)config,acStack_1d50,
                     sVar5);
      pfStack_1e08 = (fdb_kvs_handle *)0x10f146;
      fdb_set(pfStack_1de8,apfStack_1dd0[uVar22]);
      uVar22 = uVar22 + 1;
      handle = (fdb_kvs_handle *)((long)handle + 8);
    } while (uVar22 != 10);
    pfStack_1e08 = (fdb_kvs_handle *)0x10f166;
    fdb_commit((fdb_file_handle *)pfStack_1de0,'\x01');
    pfStack_1e08 = (fdb_kvs_handle *)0x10f17a;
    fVar3 = fdb_snapshot_open(pfStack_1de8,&pfStack_1dd8,10);
    ppfVar14 = (fdb_kvs_handle **)0xa;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f2df;
    pfStack_1e08 = (fdb_kvs_handle *)0x10f193;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_1de0,"./compact_test2");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      config = (fdb_kvs_config *)0x0;
      do {
        pfStack_1e08 = (fdb_kvs_handle *)0x10f1c7;
        fdb_doc_create((fdb_doc **)&pfStack_1df0,apfStack_1dd0[(long)config]->key,
                       apfStack_1dd0[(long)config]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_1e08 = (fdb_kvs_handle *)0x10f1d6;
        fVar3 = fdb_get(pfStack_1de8,(fdb_doc *)pfStack_1df0);
        if (fVar3 != FDB_RESULT_SUCCESS) {
          pfStack_1e08 = (fdb_kvs_handle *)0x10f2d5;
          unlink_after_compaction_test();
          goto LAB_0010f2d5;
        }
        pfStack_1e08 = (fdb_kvs_handle *)0x10f1e8;
        fdb_doc_free((fdb_doc *)pfStack_1df0);
        config = (fdb_kvs_config *)&config->field_0x1;
      } while (config != (fdb_kvs_config *)0xa);
      pfStack_1e08 = (fdb_kvs_handle *)0x10f205;
      iVar4 = stat("./compact_test1",(stat *)(auStack_1c50 + 0x200));
      if (iVar4 == 0) {
        pfStack_1e08 = (fdb_kvs_handle *)0x10f20e;
        unlink_after_compaction_test();
      }
      config = (fdb_kvs_config *)0x0;
      while( true ) {
        pfStack_1e08 = (fdb_kvs_handle *)0x10f23a;
        fdb_doc_create((fdb_doc **)&pfStack_1df0,apfStack_1dd0[(long)config]->key,
                       apfStack_1dd0[(long)config]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_1e08 = (fdb_kvs_handle *)0x10f249;
        fVar3 = fdb_get(pfStack_1dd8,(fdb_doc *)pfStack_1df0);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        pfStack_1e08 = (fdb_kvs_handle *)0x10f25b;
        fdb_doc_free((fdb_doc *)pfStack_1df0);
        config = (fdb_kvs_config *)&config->field_0x1;
        if (config == (fdb_kvs_config *)0xa) {
          pfStack_1e08 = (fdb_kvs_handle *)0x10f26e;
          fdb_close((fdb_file_handle *)pfStack_1de0);
          pfStack_1e08 = (fdb_kvs_handle *)0x10f273;
          fdb_shutdown();
          lVar23 = 0;
          do {
            pfStack_1e08 = (fdb_kvs_handle *)0x10f27f;
            fdb_doc_free(apfStack_1dd0[lVar23]);
            lVar23 = lVar23 + 1;
          } while (lVar23 != 10);
          pfStack_1e08 = (fdb_kvs_handle *)0x10f28d;
          memleak_end();
          pcVar11 = "%s PASSED\n";
          if (unlink_after_compaction_test()::__test_pass != '\0') {
            pcVar11 = "%s FAILED\n";
          }
          pfStack_1e08 = (fdb_kvs_handle *)0x10f2be;
          fprintf(_stderr,pcVar11,"unlink after compaction test");
          return;
        }
      }
LAB_0010f2d5:
      ppfVar14 = &pfStack_1df0;
      pfStack_1e08 = (fdb_kvs_handle *)0x10f2da;
      unlink_after_compaction_test();
      goto LAB_0010f2da;
    }
  }
  else {
LAB_0010f2da:
    pfStack_1e08 = (fdb_kvs_handle *)0x10f2df;
    unlink_after_compaction_test();
LAB_0010f2df:
    pfStack_1e08 = (fdb_kvs_handle *)0x10f2e4;
    unlink_after_compaction_test();
  }
  pfStack_1e08 = (fdb_kvs_handle *)db_compact_overwrite;
  unlink_after_compaction_test();
  pfStack_25a0 = (fdb_kvs_handle *)0x10f309;
  ppfStack_1e30 = ppfVar14;
  pfStack_1e28 = handle;
  pfStack_1e20 = doc;
  pfStack_1e18 = config;
  ppfStack_1e10 = ppfVar27;
  pfStack_1e08 = pfVar10;
  gettimeofday(&tStack_2518,(__timezone_ptr_t)0x0);
  pfStack_25a0 = (fdb_kvs_handle *)0x10f30e;
  memleak_start();
  pfStack_25a0 = (fdb_kvs_handle *)0x10f31a;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_25a0 = (fdb_kvs_handle *)0x10f32a;
  fdb_get_default_config();
  info = (fdb_kvs_info *)auStack_2560;
  pfStack_25a0 = (fdb_kvs_handle *)0x10f337;
  fdb_get_default_kvs_config();
  fStack_2310.buffercache_size = 0x1000000;
  fStack_2310.wal_threshold = 0x400;
  fStack_2310.flags = 1;
  fStack_2310.compaction_threshold = '\0';
  _Var28._M_i = (__int_type_conflict)(auStack_2578 + 0x10);
  pfStack_25a0 = (fdb_kvs_handle *)0x10f369;
  fdb_open((fdb_file_handle **)_Var28._M_i,"./compact_test1",&fStack_2310);
  ppfVar14 = (fdb_kvs_handle **)auStack_2578;
  pfStack_25a0 = (fdb_kvs_handle *)0x10f37e;
  fdb_kvs_open((fdb_file_handle *)auStack_2578._16_8_,ppfVar14,(char *)0x0,(fdb_kvs_config *)info);
  pfStack_25a0 = (fdb_kvs_handle *)0x10f394;
  pfVar15 = (fdb_kvs_handle *)auStack_2578._0_8_;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_2578._0_8_,logCallbackFunc,"db_destroy_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    handle = (fdb_kvs_handle *)0x0;
    uVar22 = 0;
    do {
      pfStack_25a0 = (fdb_kvs_handle *)0x10f3bc;
      sprintf(auStack_2218 + 0x100,"key%d",uVar22 & 0xffffffff);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f3d4;
      sprintf(auStack_2218,"meta%d",uVar22 & 0xffffffff);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f3ec;
      sprintf(acStack_2508,"body%d",uVar22 & 0xffffffff);
      _Var28._M_i = (long)apfStack_2408 + (long)handle;
      pfStack_25a0 = (fdb_kvs_handle *)0x10f3ff;
      doc = (fdb_kvs_handle *)strlen(auStack_2218 + 0x100);
      pfVar10 = (fdb_kvs_handle *)auStack_2218;
      pfStack_25a0 = (fdb_kvs_handle *)0x10f412;
      info = (fdb_kvs_info *)strlen((char *)pfVar10);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f422;
      sVar5 = strlen(acStack_2508);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f447;
      fdb_doc_create((fdb_doc **)_Var28._M_i,auStack_2218 + 0x100,(size_t)doc,pfVar10,(size_t)info,
                     acStack_2508,sVar5);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f459;
      fdb_set((fdb_kvs_handle *)auStack_2578._0_8_,apfStack_2408[uVar22]);
      uVar22 = uVar22 + 1;
      handle = (fdb_kvs_handle *)((long)handle + 8);
    } while (uVar22 != 0x1e);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f476;
    fdb_commit((fdb_file_handle *)auStack_2578._16_8_,'\0');
    pfStack_25a0 = (fdb_kvs_handle *)0x10f492;
    fdb_open((fdb_file_handle **)(auStack_2578 + 8),"./compact_test1.1",&fStack_2310);
    ppfVar14 = (fdb_kvs_handle **)(auStack_2588 + 8);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f4a9;
    fdb_kvs_open((fdb_file_handle *)auStack_2578._8_8_,ppfVar14,(char *)0x0,
                 (fdb_kvs_config *)auStack_2560);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f4bf;
    pfVar15 = (fdb_kvs_handle *)auStack_2588._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_2588._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f903;
    handle = (fdb_kvs_handle *)0x0;
    uVar22 = 0;
    do {
      pfStack_25a0 = (fdb_kvs_handle *)0x10f4e7;
      sprintf(auStack_2218 + 0x100,"k2ey%d",uVar22 & 0xffffffff);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f4ff;
      sprintf(auStack_2218,"m2eta%d",uVar22 & 0xffffffff);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f517;
      sprintf(acStack_2508,"b2ody%d",uVar22 & 0xffffffff);
      _Var28._M_i = (__int_type_conflict)(auStack_2218 + (long)handle + 0x200);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f52a;
      doc = (fdb_kvs_handle *)strlen(auStack_2218 + 0x100);
      pfVar10 = (fdb_kvs_handle *)auStack_2218;
      pfStack_25a0 = (fdb_kvs_handle *)0x10f53d;
      info = (fdb_kvs_info *)strlen((char *)pfVar10);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f54d;
      sVar5 = strlen(acStack_2508);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f572;
      fdb_doc_create((fdb_doc **)_Var28._M_i,auStack_2218 + 0x100,(size_t)doc,pfVar10,(size_t)info,
                     acStack_2508,sVar5);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f584;
      fdb_set((fdb_kvs_handle *)auStack_2588._8_8_,(fdb_doc *)auStack_1f28[uVar22 - 0x1e]);
      uVar22 = uVar22 + 1;
      handle = (fdb_kvs_handle *)((long)handle + 8);
    } while (uVar22 != 0x3c);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f5a1;
    fdb_commit((fdb_file_handle *)auStack_2578._8_8_,'\0');
    pfStack_25a0 = (fdb_kvs_handle *)0x10f5b0;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_2588._8_8_,(fdb_kvs_info *)(auStack_2560 + 0x18));
    ppfVar14 = apfStack_2540;
    if (apfStack_2540[0] != (fdb_kvs_handle *)0x3c) {
      pfStack_25a0 = (fdb_kvs_handle *)0x10f5c3;
      db_compact_overwrite();
    }
    pfStack_25a0 = (fdb_kvs_handle *)0x10f5cd;
    fdb_kvs_close((fdb_kvs_handle *)auStack_2588._8_8_);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f5d7;
    fdb_close((fdb_file_handle *)auStack_2578._8_8_);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f5e3;
    pfVar15 = (fdb_kvs_handle *)auStack_2578._16_8_;
    fVar3 = fdb_compact((fdb_file_handle *)auStack_2578._16_8_,(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f908;
    info = (fdb_kvs_info *)auStack_2578;
    pfStack_25a0 = (fdb_kvs_handle *)0x10f5f8;
    fdb_kvs_close((fdb_kvs_handle *)auStack_2578._0_8_);
    _Var28._M_i = (__int_type_conflict)(auStack_2578 + 0x10);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f605;
    fdb_close((fdb_file_handle *)auStack_2578._16_8_);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f61c;
    fdb_open((fdb_file_handle **)_Var28._M_i,"./compact_test1",&fStack_2310);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f62e;
    fdb_kvs_open((fdb_file_handle *)auStack_2578._16_8_,(fdb_kvs_handle **)info,(char *)0x0,
                 (fdb_kvs_config *)auStack_2560);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f644;
    pfVar15 = (fdb_kvs_handle *)auStack_2578._0_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_2578._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f90d;
    handle = (fdb_kvs_handle *)0x0;
    info = (fdb_kvs_info *)auStack_2588;
    do {
      pfStack_25a0 = (fdb_kvs_handle *)0x10f67b;
      fdb_doc_create((fdb_doc **)info,(void *)(*(size_t **)((long)apfStack_2408 + (long)handle))[4],
                     **(size_t **)((long)apfStack_2408 + (long)handle),(void *)0x0,0,(void *)0x0,0);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f68a;
      pfVar15 = (fdb_kvs_handle *)auStack_2578._0_8_;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_2578._0_8_,(fdb_doc *)auStack_2588._0_8_);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_25a0 = (fdb_kvs_handle *)0x10f8f9;
        db_compact_overwrite();
        goto LAB_0010f8f9;
      }
      _Var28._M_i = (long)apfStack_2408 + (long)handle;
      pfStack_25a0 = (fdb_kvs_handle *)0x10f6b6;
      iVar4 = bcmp(*(btree **)(auStack_2588._0_8_ + 0x38),(*(fdb_doc **)_Var28._M_i)->meta,
                   (size_t)((fdb_kvs_config *)auStack_2588._0_8_)->custom_cmp);
      if (iVar4 != 0) {
        pfStack_25a0 = (fdb_kvs_handle *)0x10f6ff;
        db_compact_overwrite();
      }
      pfStack_25a0 = (fdb_kvs_handle *)0x10f6d3;
      iVar4 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_2588._0_8_ + 0x40))->
                   seqtree,(*(fdb_doc **)_Var28._M_i)->body,
                   (size_t)((fdb_kvs_config *)auStack_2588._0_8_)->custom_cmp_param);
      if (iVar4 != 0) {
        pfStack_25a0 = (fdb_kvs_handle *)0x10f70c;
        db_compact_overwrite();
      }
      pfStack_25a0 = (fdb_kvs_handle *)0x10f6e1;
      fdb_doc_free((fdb_doc *)auStack_2588._0_8_);
      handle = (fdb_kvs_handle *)&(handle->kvs_config).custom_cmp;
    } while (handle != (fdb_kvs_handle *)0xf0);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f72a;
    fdb_open((fdb_file_handle **)(auStack_2578 + 8),"./compact_test1.1",&fStack_2310);
    info = (fdb_kvs_info *)(auStack_2588 + 8);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f741;
    fdb_kvs_open((fdb_file_handle *)auStack_2578._8_8_,(fdb_kvs_handle **)info,(char *)0x0,
                 (fdb_kvs_config *)auStack_2560);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f757;
    pfVar15 = (fdb_kvs_handle *)auStack_2588._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_2588._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      info = (fdb_kvs_info *)(auStack_2560 + 0x18);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f771;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_2588._8_8_,info);
      if (apfStack_2540[0] != (fdb_kvs_handle *)0x3c) {
        pfStack_25a0 = (fdb_kvs_handle *)0x10f780;
        db_compact_overwrite();
      }
      _Var28._M_i = 0;
      ppfVar14 = (fdb_kvs_handle **)auStack_2588;
      while( true ) {
        pfStack_25a0 = (fdb_kvs_handle *)0x10f7af;
        fdb_doc_create((fdb_doc **)ppfVar14,
                       (void *)(*(size_t **)(auStack_2218 + 0x200 + _Var28._M_i))[4],
                       **(size_t **)(auStack_2218 + 0x200 + _Var28._M_i),(void *)0x0,0,(void *)0x0,0
                      );
        pfStack_25a0 = (fdb_kvs_handle *)0x10f7be;
        pfVar15 = (fdb_kvs_handle *)auStack_2588._8_8_;
        fVar3 = fdb_get((fdb_kvs_handle *)auStack_2588._8_8_,(fdb_doc *)auStack_2588._0_8_);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        info = (fdb_kvs_info *)(auStack_2218 + 0x200 + _Var28._M_i);
        pfStack_25a0 = (fdb_kvs_handle *)0x10f7ea;
        iVar4 = bcmp(*(btree **)(auStack_2588._0_8_ + 0x38),*(void **)(info->name + 0x38),
                     (size_t)((fdb_kvs_config *)auStack_2588._0_8_)->custom_cmp);
        if (iVar4 != 0) {
          pfStack_25a0 = (fdb_kvs_handle *)0x10f833;
          db_compact_overwrite();
        }
        pfStack_25a0 = (fdb_kvs_handle *)0x10f807;
        iVar4 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_2588._0_8_ + 0x40))
                     ->seqtree,*(void **)(info->name + 0x40),
                     (size_t)((fdb_kvs_config *)auStack_2588._0_8_)->custom_cmp_param);
        if (iVar4 != 0) {
          pfStack_25a0 = (fdb_kvs_handle *)0x10f840;
          db_compact_overwrite();
        }
        pfStack_25a0 = (fdb_kvs_handle *)0x10f815;
        fdb_doc_free((fdb_doc *)auStack_2588._0_8_);
        _Var28._M_i = _Var28._M_i + 8;
        if ((fdb_doc **)_Var28._M_i == (fdb_doc **)0x1e0) {
          lVar23 = 0;
          do {
            pfStack_25a0 = (fdb_kvs_handle *)0x10f851;
            fdb_doc_free(apfStack_2408[lVar23]);
            pfStack_25a0 = (fdb_kvs_handle *)0x10f85e;
            fdb_doc_free((fdb_doc *)auStack_1f28[lVar23 + -0x1e]);
            lVar23 = lVar23 + 1;
          } while (lVar23 != 0x1e);
          lVar23 = 0;
          do {
            pfStack_25a0 = (fdb_kvs_handle *)0x10f876;
            fdb_doc_free((fdb_doc *)auStack_1f28[lVar23]);
            lVar23 = lVar23 + 1;
          } while (lVar23 != 0x1e);
          pfStack_25a0 = (fdb_kvs_handle *)0x10f889;
          fdb_kvs_close((fdb_kvs_handle *)auStack_2578._0_8_);
          pfStack_25a0 = (fdb_kvs_handle *)0x10f893;
          fdb_close((fdb_file_handle *)auStack_2578._16_8_);
          pfStack_25a0 = (fdb_kvs_handle *)0x10f89d;
          fdb_kvs_close((fdb_kvs_handle *)auStack_2588._8_8_);
          pfStack_25a0 = (fdb_kvs_handle *)0x10f8a7;
          fdb_close((fdb_file_handle *)auStack_2578._8_8_);
          pfStack_25a0 = (fdb_kvs_handle *)0x10f8ac;
          fdb_shutdown();
          pfStack_25a0 = (fdb_kvs_handle *)0x10f8b1;
          memleak_end();
          pcVar11 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar11 = "%s FAILED\n";
          }
          pfStack_25a0 = (fdb_kvs_handle *)0x10f8e2;
          fprintf(_stderr,pcVar11,"compact overwrite");
          return;
        }
      }
LAB_0010f8f9:
      pfStack_25a0 = (fdb_kvs_handle *)0x10f8fe;
      db_compact_overwrite();
      goto LAB_0010f8fe;
    }
  }
  else {
LAB_0010f8fe:
    pfStack_25a0 = (fdb_kvs_handle *)0x10f903;
    db_compact_overwrite();
LAB_0010f903:
    pfStack_25a0 = (fdb_kvs_handle *)0x10f908;
    db_compact_overwrite();
LAB_0010f908:
    pfStack_25a0 = (fdb_kvs_handle *)0x10f90d;
    db_compact_overwrite();
LAB_0010f90d:
    pfStack_25a0 = (fdb_kvs_handle *)0x10f912;
    db_compact_overwrite();
  }
  pfStack_25a0 = (fdb_kvs_handle *)db_compact_during_doc_delete;
  db_compact_overwrite();
  pfStack_2d78 = (fdb_kvs_handle *)0x10f937;
  ppfStack_25c8 = ppfVar14;
  pfStack_25c0 = handle;
  pfStack_25b8 = doc;
  pfStack_25b0 = info;
  ppfStack_25a8 = (fdb_doc **)_Var28._M_i;
  pfStack_25a0 = pfVar10;
  gettimeofday(&tStack_2cf8,(__timezone_ptr_t)0x0);
  pfStack_2d78 = (fdb_kvs_handle *)0x10f93c;
  memleak_start();
  pfStack_2d78 = (fdb_kvs_handle *)0x10f946;
  fdb_get_default_kvs_config();
  pfVar18 = (fdb_kvs_handle *)auStack_2ce8;
  pfStack_2d78 = (fdb_kvs_handle *)0x10f956;
  fdb_get_default_config();
  auStack_2ce8._8_8_ = (list *)0x0;
  auStack_2ce8._16_8_ = (list *)0x400;
  auStack_2ce8[0x2f] = '\0';
  if (pfVar15 == (fdb_kvs_handle *)0x0) {
    pfStack_2d78 = (fdb_kvs_handle *)0x10f980;
    system("rm -rf  compact_test* > errorlog.txt");
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_2d60;
    pfStack_2d78 = (fdb_kvs_handle *)0x10f999;
    fVar3 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_2ce8);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_2d78 = (fdb_kvs_handle *)0x10f9b5;
      ptr_fhandle = pfStack_2d60;
      fVar3 = fdb_kvs_open_default((fdb_file_handle *)pfStack_2d60,&pfStack_2d58,&fStack_2d40);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fc6b;
      lVar23 = 0;
      uVar22 = 0;
      do {
        pfStack_2d78 = (fdb_kvs_handle *)0x10f9dd;
        sprintf(acStack_29f0,"key%d",uVar22 & 0xffffffff);
        pfStack_2d78 = (fdb_kvs_handle *)0x10f9f5;
        sprintf(auStack_2ce8 + 0x1f8,"meta%d",uVar22 & 0xffffffff);
        pfStack_2d78 = (fdb_kvs_handle *)0x10fa0d;
        sprintf(auStack_2ce8 + 0xf8,"body%d",uVar22 & 0xffffffff);
        pfStack_2d78 = (fdb_kvs_handle *)0x10fa20;
        doc = (fdb_kvs_handle *)strlen(acStack_29f0);
        pfVar10 = (fdb_kvs_handle *)(auStack_2ce8 + 0x1f8);
        pfStack_2d78 = (fdb_kvs_handle *)0x10fa33;
        sVar5 = strlen((char *)pfVar10);
        pfStack_2d78 = (fdb_kvs_handle *)0x10fa43;
        sVar6 = strlen(auStack_2ce8 + 0xf8);
        pfStack_2d78 = (fdb_kvs_handle *)0x10fa68;
        fdb_doc_create((fdb_doc **)((long)apfStack_28f0 + lVar23),acStack_29f0,(size_t)doc,pfVar10,
                       sVar5,auStack_2ce8 + 0xf8,sVar6);
        pfStack_2d78 = (fdb_kvs_handle *)0x10fa7a;
        fdb_set(pfStack_2d58,apfStack_28f0[uVar22]);
        uVar22 = uVar22 + 1;
        lVar23 = lVar23 + 8;
      } while (uVar22 != 100);
      pfStack_2d78 = (fdb_kvs_handle *)0x10fa97;
      fdb_commit((fdb_file_handle *)pfStack_2d60,'\0');
      pfStack_2d78 = (fdb_kvs_handle *)0x10faa6;
      fdb_get_kvs_info(pfStack_2d58,(fdb_kvs_info *)auStack_2d28);
      pfVar15 = (fdb_kvs_handle *)(auStack_2d28 + 0x10);
      if ((filemgr *)auStack_2d28._16_8_ != (filemgr *)0x64) {
        pfStack_2d78 = (fdb_kvs_handle *)0x10fab9;
        db_compact_during_doc_delete();
      }
      lVar23 = 0;
      _Var28._M_i = (__int_type_conflict)&pfStack_2d50;
      do {
        pfStack_2d78 = (fdb_kvs_handle *)0x10fada;
        fdb_del(pfStack_2d58,apfStack_28f0[lVar23]);
        if (lVar23 == 0x32) {
          pfStack_2d78 = (fdb_kvs_handle *)0x10faf2;
          pthread_create((pthread_t *)_Var28._M_i,(pthread_attr_t *)0x0,db_compact_during_doc_delete
                         ,pfStack_2d60);
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 100);
      pfStack_2d78 = (fdb_kvs_handle *)0x10fb0a;
      pthread_join((pthread_t)pfStack_2d50,&pvStack_2d48);
      pfStack_2d78 = (fdb_kvs_handle *)0x10fb19;
      fdb_commit((fdb_file_handle *)pfStack_2d60,'\x01');
      pfStack_2d78 = (fdb_kvs_handle *)0x10fb2b;
      fdb_get_kvs_info(pfStack_2d58,(fdb_kvs_info *)auStack_2d28);
      if ((filemgr *)auStack_2d28._16_8_ != (filemgr *)0x0) {
        pfStack_2d78 = (fdb_kvs_handle *)0x10fb3a;
        db_compact_during_doc_delete();
      }
      pfStack_2d78 = (fdb_kvs_handle *)0x10fb44;
      fdb_kvs_close(pfStack_2d58);
      pfVar18 = (fdb_kvs_handle *)&pfStack_2d60;
      pfStack_2d78 = (fdb_kvs_handle *)0x10fb51;
      fdb_close((fdb_file_handle *)pfStack_2d60);
      pfStack_2d78 = (fdb_kvs_handle *)0x10fb68;
      ptr_fhandle = pfVar18;
      fVar3 = fdb_open((fdb_file_handle **)pfVar18,"./compact_test1",(fdb_config *)auStack_2ce8);
      handle = (fdb_kvs_handle *)0x64;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fc70;
      pfStack_2d78 = (fdb_kvs_handle *)0x10fb84;
      ptr_fhandle = pfStack_2d60;
      fVar3 = fdb_kvs_open_default((fdb_file_handle *)pfStack_2d60,&pfStack_2d58,&fStack_2d40);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pfStack_2d78 = (fdb_kvs_handle *)0x10fb9e;
        fdb_get_kvs_info(pfStack_2d58,(fdb_kvs_info *)auStack_2d28);
        if ((filemgr *)auStack_2d28._16_8_ != (filemgr *)0x0) {
          pfStack_2d78 = (fdb_kvs_handle *)0x10fbad;
          db_compact_during_doc_delete();
        }
        lVar23 = 0;
        do {
          pfStack_2d78 = (fdb_kvs_handle *)0x10fbbc;
          fdb_doc_free(apfStack_28f0[lVar23]);
          lVar23 = lVar23 + 1;
        } while (lVar23 != 100);
        pfStack_2d78 = (fdb_kvs_handle *)0x10fbcf;
        fdb_kvs_close(pfStack_2d58);
        pfStack_2d78 = (fdb_kvs_handle *)0x10fbd9;
        fdb_close((fdb_file_handle *)pfStack_2d60);
        pfStack_2d78 = (fdb_kvs_handle *)0x10fbde;
        fdb_shutdown();
        pfStack_2d78 = (fdb_kvs_handle *)0x10fbe3;
        memleak_end();
        pcVar11 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar11 = "%s FAILED\n";
        }
        pfStack_2d78 = (fdb_kvs_handle *)0x10fc14;
        fprintf(_stderr,pcVar11,"multi thread client shutdown");
        return;
      }
    }
    else {
      pfStack_2d78 = (fdb_kvs_handle *)0x10fc6b;
      db_compact_during_doc_delete();
LAB_0010fc6b:
      pfStack_2d78 = (fdb_kvs_handle *)0x10fc70;
      db_compact_during_doc_delete();
LAB_0010fc70:
      pfStack_2d78 = (fdb_kvs_handle *)0x10fc75;
      db_compact_during_doc_delete();
    }
    pfStack_2d78 = (fdb_kvs_handle *)0x10fc7a;
    db_compact_during_doc_delete();
LAB_0010fc7a:
    pfStack_2d78 = (fdb_kvs_handle *)0x10fc7f;
    db_compact_during_doc_delete();
  }
  else {
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_2d60;
    pfStack_2d78 = (fdb_kvs_handle *)0x10fc41;
    fVar3 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_2ce8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fc7a;
    pfStack_2d78 = (fdb_kvs_handle *)0x10fc51;
    ptr_fhandle = pfStack_2d60;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_2d60,(char *)0x0);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_2d78 = (fdb_kvs_handle *)0x10fc5f;
      fdb_close((fdb_file_handle *)pfStack_2d60);
      pfStack_2d78 = (fdb_kvs_handle *)0x10fc66;
      pthread_exit((void *)0x0);
    }
  }
  pfStack_2d78 = (fdb_kvs_handle *)compaction_daemon_test;
  db_compact_during_doc_delete();
  pcVar16 = (char *)0x0;
  pfStack_16b30 = (fdb_kvs_handle *)0x10fcab;
  pfStack_16ae8 = ptr_fhandle;
  pfStack_2da0 = pfVar15;
  pfStack_2d98 = handle;
  pfStack_2d90 = doc;
  pfStack_2d88 = pfVar18;
  ppfStack_2d80 = (fdb_doc **)_Var28._M_i;
  pfStack_2d78 = pfVar10;
  gettimeofday(&tStack_16980,(__timezone_ptr_t)0x0);
  pfStack_16b30 = (fdb_kvs_handle *)0x10fcb0;
  memleak_start();
  pfStack_16b30 = (fdb_kvs_handle *)0x10fcbc;
  system("rm -rf  compact_test* > errorlog.txt");
  pfVar15 = (fdb_kvs_handle *)auStack_16a88;
  pfStack_16b30 = (fdb_kvs_handle *)0x10fccc;
  fdb_get_default_config();
  pfStack_16b30 = (fdb_kvs_handle *)0x10fcd6;
  fdb_get_default_kvs_config();
  auStack_16a88._8_8_ = (kvs_ops_stat *)0x0;
  auStack_16a88._16_8_ = (fdb_file_handle *)0x400;
  auStack_16a88._36_4_ = 1;
  auStack_16a88._46_2_ = 0x1e01;
  auStack_16a88._56_8_ = (docio_handle *)0x1;
  auStack_16a88._120_8_ = 0;
  pcVar11 = auStack_16b18;
  pfStack_16b30 = (fdb_kvs_handle *)0x10fd11;
  fVar3 = fdb_open((fdb_file_handle **)pcVar11,"compact_test",(fdb_config *)pfVar15);
  if (fVar3 == FDB_RESULT_INVALID_CONFIG) {
    auStack_16a88._120_8_ = 4;
    pfStack_16b30 = (fdb_kvs_handle *)0x10fd3e;
    fdb_open((fdb_file_handle **)auStack_16b18,"compact_test",(fdb_config *)auStack_16a88);
    pfVar15 = (fdb_kvs_handle *)(auStack_16b18 + 8);
    pfStack_16b30 = (fdb_kvs_handle *)0x10fd53;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_16b18._0_8_,(fdb_kvs_handle **)pfVar15,&fStack_16ae0);
    pfStack_16b30 = (fdb_kvs_handle *)0x10fd69;
    pcVar11 = (char *)auStack_16b18._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_16b18._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110810;
    pfStack_16b30 = (fdb_kvs_handle *)0x10fd7d;
    puts("Initialize..");
    pcVar16 = (char *)0x0;
    uVar22 = 0;
    do {
      pfStack_16b30 = (fdb_kvs_handle *)0x10fd9e;
      sprintf((char *)apfStack_16928,"key%04d",uVar22 & 0xffffffff);
      pfStack_16b30 = (fdb_kvs_handle *)0x10fdba;
      sprintf(acStack_16828,"meta%04d",uVar22 & 0xffffffff);
      pfStack_16b30 = (fdb_kvs_handle *)0x10fdd6;
      sprintf(acStack_16728,"body%04d",uVar22 & 0xffffffff);
      pfVar10 = (fdb_kvs_handle *)(&afStack_16628[0].kvs_config.create_if_missing + (long)pcVar16);
      pfStack_16b30 = (fdb_kvs_handle *)0x10fde9;
      sVar5 = strlen((char *)apfStack_16928);
      _Var28._M_i = sVar5 + 1;
      pfStack_16b30 = (fdb_kvs_handle *)0x10fdf5;
      sVar5 = strlen(acStack_16828);
      doc = (fdb_kvs_handle *)(sVar5 + 1);
      pfStack_16b30 = (fdb_kvs_handle *)0x10fe01;
      sVar5 = strlen(acStack_16728);
      pfStack_16b30 = (fdb_kvs_handle *)0x10fe29;
      fdb_doc_create((fdb_doc **)pfVar10,apfStack_16928,_Var28._M_i,acStack_16828,(size_t)doc,
                     acStack_16728,sVar5 + 1);
      pfStack_16b30 = (fdb_kvs_handle *)0x10fe3b;
      fdb_set((fdb_kvs_handle *)auStack_16b18._8_8_,
              *(fdb_doc **)(&afStack_16628[0].kvs_config.create_if_missing + uVar22 * 8));
      uVar22 = uVar22 + 1;
      pcVar16 = (char *)((long)pcVar16 + 8);
    } while (uVar22 != 10000);
    pfVar15 = (fdb_kvs_handle *)auStack_16b18;
    pfStack_16b30 = (fdb_kvs_handle *)0x10fe5e;
    fdb_commit((fdb_file_handle *)auStack_16b18._0_8_,'\0');
    pfStack_16b30 = (fdb_kvs_handle *)0x10fe66;
    fdb_close((fdb_file_handle *)auStack_16b18._0_8_);
    pfStack_16b30 = (fdb_kvs_handle *)0x10fe7d;
    pcVar11 = (char *)pfVar15;
    fVar3 = fdb_open((fdb_file_handle **)pfVar15,"compact_test",(fdb_config *)auStack_16a88);
    handle = (fdb_kvs_handle *)0x2710;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110815;
    pfStack_16b30 = (fdb_kvs_handle *)0x10fe99;
    pcVar11 = (char *)auStack_16b18._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_16b18._0_8_,(fdb_kvs_handle **)(auStack_16b18 + 8)
                       ,&fStack_16ae0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011081a;
    pfStack_16b30 = (fdb_kvs_handle *)0x10feb9;
    pcVar11 = (char *)auStack_16b18._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_16b18._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011081f;
    pfVar15 = (fdb_kvs_handle *)&_Stack_16970;
    pfStack_16b30 = (fdb_kvs_handle *)0x10fed6;
    fdb_get_file_info((fdb_file_handle *)auStack_16b18._0_8_,(fdb_file_info *)pfVar15);
    pfStack_16b30 = (fdb_kvs_handle *)0x10fee5;
    iVar4 = strcmp((char *)_Stack_16970._M_i,"compact_test");
    if (iVar4 != 0) {
      pfStack_16b30 = (fdb_kvs_handle *)0x10fef6;
      compaction_daemon_test();
    }
    pcVar16 = "key%04d";
    _Var28._M_i = (__int_type_conflict)apfStack_16928;
    doc = (fdb_kvs_handle *)0x0;
    pfVar18 = pfVar10;
    do {
      pfStack_16b30 = (fdb_kvs_handle *)0x10ff18;
      sprintf((char *)_Var28._M_i,"key%04d",(ulong)doc & 0xffffffff);
      pfStack_16b30 = (fdb_kvs_handle *)0x10ff20;
      sVar5 = strlen((char *)_Var28._M_i);
      pfStack_16b30 = (fdb_kvs_handle *)0x10ff41;
      fdb_doc_create((fdb_doc **)&pfStack_16b00,(void *)_Var28._M_i,sVar5 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_16b30 = (fdb_kvs_handle *)0x10ff50;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_16b18._8_8_,(fdb_doc *)pfStack_16b00);
      pfVar10 = pfStack_16b00;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_001107e6:
        pfStack_16b30 = (fdb_kvs_handle *)0x1107eb;
        compaction_daemon_test();
        goto LAB_001107eb;
      }
      pfVar15 = (fdb_kvs_handle *)(pfStack_16b00->field_6).seqtree;
      handle = *(fdb_kvs_handle **)
                (*(long *)(&afStack_16628[0].kvs_config.create_if_missing + (long)doc * 8) + 0x40);
      pfStack_16b30 = (fdb_kvs_handle *)0x10ff7c;
      iVar4 = bcmp(pfVar15,handle,(size_t)(pfStack_16b00->kvs_config).custom_cmp_param);
      pfVar18 = pfVar10;
      if (iVar4 != 0) {
        pfStack_16b30 = (fdb_kvs_handle *)0x1107e6;
        compaction_daemon_test();
        goto LAB_001107e6;
      }
      pfStack_16b30 = (fdb_kvs_handle *)0x10ff8c;
      fdb_doc_free((fdb_doc *)pfVar10);
      doc = (fdb_kvs_handle *)&(doc->kvs_config).field_0x1;
    } while (doc != (fdb_kvs_handle *)0x2710);
    pfStack_16b30 = (fdb_kvs_handle *)0x10ffb0;
    pcVar11 = (char *)auStack_16b18._8_8_;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_16b18._8_8_,
                              (fdb_kvs_handle **)&pfStack_16ac0,10000);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110824;
    pfStack_16b30 = (fdb_kvs_handle *)0x10ffc2;
    fdb_kvs_close((fdb_kvs_handle *)pfStack_16ac0);
    pfVar15 = (fdb_kvs_handle *)auStack_16b18;
    pfStack_16b30 = (fdb_kvs_handle *)0x10ffcf;
    fdb_close((fdb_file_handle *)auStack_16b18._0_8_);
    pfStack_16b30 = (fdb_kvs_handle *)0x10ffdb;
    system("rm -rf  compact_test.meta > errorlog.txt");
    pfStack_16b30 = (fdb_kvs_handle *)0x10fff2;
    pcVar11 = (char *)pfVar15;
    fVar3 = fdb_open((fdb_file_handle **)pfVar15,"compact_test",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110829;
    pfStack_16b30 = (fdb_kvs_handle *)0x11000e;
    pcVar11 = (char *)auStack_16b18._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_16b18._0_8_,(fdb_kvs_handle **)(auStack_16b18 + 8)
                       ,&fStack_16ae0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011082e;
    pfStack_16b30 = (fdb_kvs_handle *)0x11002e;
    pcVar11 = (char *)auStack_16b18._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_16b18._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110833;
    pcVar16 = "key%04d";
    _Var28._M_i = (__int_type_conflict)apfStack_16928;
    doc = (fdb_kvs_handle *)0x0;
    do {
      pfStack_16b30 = (fdb_kvs_handle *)0x110058;
      sprintf((char *)_Var28._M_i,"key%04d",(ulong)doc & 0xffffffff);
      pfStack_16b30 = (fdb_kvs_handle *)0x110060;
      sVar5 = strlen((char *)_Var28._M_i);
      pfStack_16b30 = (fdb_kvs_handle *)0x110081;
      fdb_doc_create((fdb_doc **)&pfStack_16b00,(void *)_Var28._M_i,sVar5 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_16b30 = (fdb_kvs_handle *)0x110090;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_16b18._8_8_,(fdb_doc *)pfStack_16b00);
      pfVar18 = pfStack_16b00;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001107f6;
      pfVar15 = (fdb_kvs_handle *)(pfStack_16b00->field_6).seqtree;
      handle = *(fdb_kvs_handle **)
                (*(long *)(&afStack_16628[0].kvs_config.create_if_missing + (long)doc * 8) + 0x40);
      pfStack_16b30 = (fdb_kvs_handle *)0x1100bc;
      iVar4 = bcmp(pfVar15,handle,(size_t)(pfStack_16b00->kvs_config).custom_cmp_param);
      if (iVar4 != 0) goto LAB_001107eb;
      pfStack_16b30 = (fdb_kvs_handle *)0x1100cc;
      fdb_doc_free((fdb_doc *)pfVar18);
      doc = (fdb_kvs_handle *)&(doc->kvs_config).field_0x1;
      pfVar10 = pfVar18;
    } while (doc != (fdb_kvs_handle *)0x2710);
    pfVar15 = (fdb_kvs_handle *)auStack_16b18;
    pfStack_16b30 = (fdb_kvs_handle *)0x1100e9;
    fdb_close((fdb_file_handle *)auStack_16b18._0_8_);
    pfStack_16b30 = (fdb_kvs_handle *)0x1100f5;
    system("mv  compact_test.0 compact_test.23 > errorlog.txt");
    pfStack_16b30 = (fdb_kvs_handle *)0x11010c;
    pcVar11 = (char *)pfVar15;
    fVar3 = fdb_open((fdb_file_handle **)pfVar15,"compact_test",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110838;
    pfStack_16b30 = (fdb_kvs_handle *)0x110128;
    pcVar11 = (char *)auStack_16b18._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_16b18._0_8_,(fdb_kvs_handle **)(auStack_16b18 + 8)
                       ,&fStack_16ae0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011083d;
    pfStack_16b30 = (fdb_kvs_handle *)0x110148;
    pcVar11 = (char *)auStack_16b18._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_16b18._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110842;
    pcVar16 = "key%04d";
    _Var28._M_i = (__int_type_conflict)apfStack_16928;
    doc = (fdb_kvs_handle *)0x0;
    do {
      pfStack_16b30 = (fdb_kvs_handle *)0x110172;
      sprintf((char *)_Var28._M_i,"key%04d",(ulong)doc & 0xffffffff);
      pfStack_16b30 = (fdb_kvs_handle *)0x11017a;
      sVar5 = strlen((char *)_Var28._M_i);
      pfStack_16b30 = (fdb_kvs_handle *)0x11019b;
      fdb_doc_create((fdb_doc **)&pfStack_16b00,(void *)_Var28._M_i,sVar5 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_16b30 = (fdb_kvs_handle *)0x1101aa;
      pcVar11 = (char *)auStack_16b18._8_8_;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_16b18._8_8_,(fdb_doc *)pfStack_16b00);
      pfVar18 = pfStack_16b00;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110806;
      pfVar15 = (fdb_kvs_handle *)(pfStack_16b00->field_6).seqtree;
      handle = *(fdb_kvs_handle **)
                (*(long *)(&afStack_16628[0].kvs_config.create_if_missing + (long)doc * 8) + 0x40);
      pfStack_16b30 = (fdb_kvs_handle *)0x1101d6;
      iVar4 = bcmp(pfVar15,handle,(size_t)(pfStack_16b00->kvs_config).custom_cmp_param);
      if (iVar4 != 0) goto LAB_001107fb;
      pfStack_16b30 = (fdb_kvs_handle *)0x1101e6;
      fdb_doc_free((fdb_doc *)pfVar18);
      doc = (fdb_kvs_handle *)&(doc->kvs_config).field_0x1;
      pfVar10 = pfVar18;
    } while (doc != (fdb_kvs_handle *)0x2710);
    pfStack_16b30 = (fdb_kvs_handle *)0x110200;
    fdb_close((fdb_file_handle *)auStack_16b18._0_8_);
    pcVar11 = (char *)&pfStack_16af0;
    pfStack_16b30 = (fdb_kvs_handle *)0x110219;
    fVar3 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_less",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110847;
    pfStack_16b30 = (fdb_kvs_handle *)0x110238;
    pcVar11 = (char *)pfStack_16af0;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_16af0,(fdb_kvs_handle **)&pfStack_16aa8,
                       &fStack_16ae0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011084c;
    auStack_16a88._46_2_ = auStack_16a88._46_2_ & 0xff;
    pcVar11 = (char *)&pfStack_16af8;
    pfStack_16b30 = (fdb_kvs_handle *)0x11025d;
    fVar3 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_non",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110851;
    pfStack_16b30 = (fdb_kvs_handle *)0x110279;
    pcVar11 = (char *)pfStack_16af8;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_16af8,(fdb_kvs_handle **)&aStack_16ab0.seqtree,
                       &fStack_16ae0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110856;
    auStack_16a88._46_2_ = auStack_16a88._46_2_ & 0xff00;
    pcVar11 = (char *)&pfStack_16b08;
    pfStack_16b30 = (fdb_kvs_handle *)0x11029e;
    fVar3 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_manual",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011085b;
    pfStack_16b30 = (fdb_kvs_handle *)0x1102ba;
    pcVar11 = (char *)pfStack_16b08;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_16b08,(fdb_kvs_handle **)&aStack_16ab8.seqtree,
                       &fStack_16ae0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110860;
    auStack_16a88._46_2_ = 0x1e01;
    pcVar11 = auStack_16b18;
    pfStack_16b30 = (fdb_kvs_handle *)0x1102e1;
    fVar3 = fdb_open((fdb_file_handle **)pcVar11,"compact_test",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110865;
    pfStack_16b30 = (fdb_kvs_handle *)0x1102fd;
    pcVar11 = (char *)auStack_16b18._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_16b18._0_8_,(fdb_kvs_handle **)(auStack_16b18 + 8)
                       ,&fStack_16ae0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011086a;
    pfStack_16b30 = (fdb_kvs_handle *)0x11031d;
    pcVar11 = (char *)auStack_16b18._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_16b18._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011086f;
    pcVar16 = (char *)0x0;
    pfStack_16b30 = (fdb_kvs_handle *)0x11033a;
    printf("wait for %d seconds..\n");
    pfStack_16b30 = (fdb_kvs_handle *)0x11034c;
    gettimeofday((timeval *)(auStack_16a88 + 0xf8),(__timezone_ptr_t)0x0);
    tVar30.tv_usec = _Stack_16988._M_i;
    tVar30.tv_sec = auStack_16a88._248_8_;
    do {
      pfVar18 = (fdb_kvs_handle *)0xfffffffffffec780;
      doc = (fdb_kvs_handle *)0x0;
      iVar4 = 0;
      aStack_16ac8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar16;
      do {
        pfStack_16b30 = (fdb_kvs_handle *)0x110388;
        fdb_set((fdb_kvs_handle *)auStack_16b18._8_8_,*(fdb_doc **)(acStack_2da8 + (long)pfVar18));
        pfStack_16b30 = (fdb_kvs_handle *)0x110394;
        fdb_commit((fdb_file_handle *)auStack_16b18._0_8_,'\0');
        uVar20 = (int)((ulong)doc / 100) * 100 + iVar4;
        handle = (fdb_kvs_handle *)(ulong)uVar20;
        if (uVar20 == 0) {
          pfStack_16b30 = (fdb_kvs_handle *)0x1103ae;
          fdb_set((fdb_kvs_handle *)pfStack_16aa8,*(fdb_doc **)(acStack_2da8 + (long)pfVar18));
          pfStack_16b30 = (fdb_kvs_handle *)0x1103ba;
          fdb_commit((fdb_file_handle *)pfStack_16af0,'\0');
        }
        pfStack_16b30 = (fdb_kvs_handle *)0x1103cc;
        fdb_set((fdb_kvs_handle *)aStack_16ab0.seqtree,*(fdb_doc **)(acStack_2da8 + (long)pfVar18));
        pfStack_16b30 = (fdb_kvs_handle *)0x1103d8;
        fdb_commit((fdb_file_handle *)pfStack_16af8,'\0');
        pfStack_16b30 = (fdb_kvs_handle *)0x1103ea;
        fdb_set((fdb_kvs_handle *)aStack_16ab8.seqtree,*(fdb_doc **)(acStack_2da8 + (long)pfVar18));
        pfStack_16b30 = (fdb_kvs_handle *)0x1103f6;
        fdb_commit((fdb_file_handle *)pfStack_16b08,'\0');
        pfStack_16b30 = (fdb_kvs_handle *)0x110405;
        gettimeofday((timeval *)&tStack_16a98,(__timezone_ptr_t)0x0);
        pfStack_16b30 = (fdb_kvs_handle *)0x110420;
        tVar29 = _utime_gap(tVar30,tStack_16a98);
        if (pfStack_16ae8 <= (fdb_kvs_handle *)tVar29.tv_sec) {
          pcVar16 = (char *)(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
          break;
        }
        iVar4 = iVar4 + -1;
        doc = (fdb_kvs_handle *)(ulong)((int)doc + 1);
        pfVar18 = (fdb_kvs_handle *)&(pfVar18->kvs_config).custom_cmp;
        pcVar16 = (char *)aStack_16ac8;
      } while (pfVar18 != (fdb_kvs_handle *)0x0);
    } while ((int)pcVar16 == 0);
    pfStack_16b30 = (fdb_kvs_handle *)0x110459;
    pcVar11 = (char *)auStack_16b18._0_8_;
    fVar3 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_16b18._0_8_,0x3c);
    pfVar15 = (fdb_kvs_handle *)auStack_16a88._248_8_;
    _Var28._M_i = _Stack_16988._M_i;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110874;
    pfStack_16b30 = (fdb_kvs_handle *)0x110470;
    pcVar11 = (char *)auStack_16b18._0_8_;
    fVar3 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_16b18._0_8_,1);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110879;
    pfStack_16b30 = (fdb_kvs_handle *)0x110484;
    pcVar11 = (char *)pfStack_16af8;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_16af8,(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011087e;
    pfStack_16b30 = (fdb_kvs_handle *)0x11049d;
    pcVar11 = (char *)pfStack_16b08;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_16b08,"compact_test_manual_compacted");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110883;
    auStack_16a88._46_2_ = auStack_16a88._46_2_ & 0xff00;
    pcVar11 = (char *)&pfStack_16aa0;
    pfStack_16b30 = (fdb_kvs_handle *)0x1104c5;
    fVar3 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_manual_compacted",
                     (fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110888;
    pfStack_16b30 = (fdb_kvs_handle *)0x1104e1;
    pcVar11 = (char *)pfStack_16b08;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_16b08,'\x01',0x1e);
    if (fVar3 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011088d;
    pfStack_16b30 = (fdb_kvs_handle *)0x1104f7;
    fVar3 = fdb_close((fdb_file_handle *)pfStack_16aa0);
    pcVar11 = (char *)pfStack_16aa0;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110892;
    pfStack_16b30 = (fdb_kvs_handle *)0x110513;
    pcVar11 = (char *)pfStack_16b08;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_16b08,'\x01',10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110897;
    pfStack_16b30 = (fdb_kvs_handle *)0x11052f;
    pcVar11 = (char *)pfStack_16b08;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_16b08,'\x01',0x1e);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011089c;
    pfStack_16b30 = (fdb_kvs_handle *)0x110541;
    pcVar11 = (char *)pfStack_16b08;
    fVar3 = fdb_close((fdb_file_handle *)pfStack_16b08);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108a1;
    auStack_16a88[0x2e] = 1;
    pcVar11 = (char *)&pfStack_16b08;
    pfStack_16b30 = (fdb_kvs_handle *)0x110566;
    fVar3 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_manual_compacted",
                     (fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108a6;
    pfStack_16b30 = (fdb_kvs_handle *)0x11057c;
    pcVar11 = (char *)pfStack_16af8;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_16af8,'\0',0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108ab;
    pfStack_16b30 = (fdb_kvs_handle *)0x11058e;
    pcVar11 = (char *)pfStack_16af8;
    fVar3 = fdb_close((fdb_file_handle *)pfStack_16af8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108b0;
    auStack_16a88._46_2_ = auStack_16a88._46_2_ & 0xff00;
    pcVar11 = (char *)&pfStack_16af8;
    pfStack_16b30 = (fdb_kvs_handle *)0x1105b3;
    fVar3 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_non",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108b5;
    pcVar16 = "compact_test_non.manual";
    pfStack_16b30 = (fdb_kvs_handle *)0x1105cf;
    fdb_compact((fdb_file_handle *)pfStack_16af8,"compact_test_non.manual");
    pfVar15 = (fdb_kvs_handle *)auStack_16b18;
    pfStack_16b30 = (fdb_kvs_handle *)0x1105dc;
    fdb_close((fdb_file_handle *)auStack_16b18._0_8_);
    pfStack_16b30 = (fdb_kvs_handle *)0x1105e6;
    fdb_close((fdb_file_handle *)pfStack_16af0);
    pfStack_16b30 = (fdb_kvs_handle *)0x1105f0;
    fdb_close((fdb_file_handle *)pfStack_16b08);
    auStack_16a88[0x2e] = 1;
    pfStack_16b30 = (fdb_kvs_handle *)0x110607;
    pcVar11 = (char *)pfVar15;
    fVar3 = fdb_open((fdb_file_handle **)pfVar15,"compact_test_non.manual",
                     (fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108ba;
    pcVar11 = "compact_test_non.manual";
    pfStack_16b30 = (fdb_kvs_handle *)0x110624;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108bf;
    auStack_16a88._46_2_ = auStack_16a88._46_2_ & 0xff00;
    pcVar11 = auStack_16b18;
    pfStack_16b30 = (fdb_kvs_handle *)0x11064a;
    fVar3 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_manual_compacted",
                     (fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c4;
    pcVar11 = "compact_test_manual_compacted";
    pfStack_16b30 = (fdb_kvs_handle *)0x110667;
    fVar3 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c9;
    auStack_16a88[0x2e] = 1;
    pcVar11 = "compact_test_manual_compacted";
    pfStack_16b30 = (fdb_kvs_handle *)0x110688;
    fVar3 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108ce;
    auStack_16a88._46_2_ = auStack_16a88._46_2_ & 0xff00;
    pcVar11 = "compact_test_non.manual";
    pfStack_16b30 = (fdb_kvs_handle *)0x1106a8;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_FILE_IS_BUSY) goto LAB_001108d3;
    pfStack_16b30 = (fdb_kvs_handle *)0x1106bb;
    fdb_close((fdb_file_handle *)pfStack_16af8);
    pfStack_16b30 = (fdb_kvs_handle *)0x1106c0;
    fVar3 = fdb_shutdown();
    pcVar11 = (char *)pfStack_16af8;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108d8;
    pcVar11 = "compact_test_non.manual";
    pfStack_16b30 = (fdb_kvs_handle *)0x1106dc;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108dd;
    auStack_16a88._36_4_ = 2;
    pcVar11 = auStack_16b18;
    pfStack_16b30 = (fdb_kvs_handle *)0x110704;
    fVar3 = fdb_open((fdb_file_handle **)pcVar11,"./compact_test_manual_compacted",
                     (fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e2;
    pcVar11 = auStack_16b18;
    pfStack_16b30 = (fdb_kvs_handle *)0x110726;
    fVar3 = fdb_open((fdb_file_handle **)pcVar11,"./compact_test_manual_compacted.meta",
                     (fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e7;
    pcVar11 = auStack_16b18;
    pfStack_16b30 = (fdb_kvs_handle *)0x110748;
    fVar3 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_non",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108ec;
    pcVar11 = auStack_16b18;
    pfStack_16b30 = (fdb_kvs_handle *)0x11076a;
    fVar3 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_non.manual",
                     (fdb_config *)auStack_16a88);
    if (fVar3 == FDB_RESULT_NO_SUCH_FILE) {
      lVar23 = 0;
      do {
        pfStack_16b30 = (fdb_kvs_handle *)0x110782;
        fdb_doc_free(*(fdb_doc **)(&afStack_16628[0].kvs_config.create_if_missing + lVar23 * 8));
        lVar23 = lVar23 + 1;
      } while (lVar23 != 10000);
      pfStack_16b30 = (fdb_kvs_handle *)0x110793;
      fdb_shutdown();
      pfStack_16b30 = (fdb_kvs_handle *)0x110798;
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      pfStack_16b30 = (fdb_kvs_handle *)0x1107c9;
      fprintf(_stderr,pcVar11,"compaction daemon test");
      return;
    }
  }
  else {
LAB_0011080b:
    pfStack_16b30 = (fdb_kvs_handle *)0x110810;
    compaction_daemon_test();
LAB_00110810:
    pfStack_16b30 = (fdb_kvs_handle *)0x110815;
    compaction_daemon_test();
LAB_00110815:
    pfStack_16b30 = (fdb_kvs_handle *)0x11081a;
    compaction_daemon_test();
LAB_0011081a:
    pfStack_16b30 = (fdb_kvs_handle *)0x11081f;
    compaction_daemon_test();
LAB_0011081f:
    pfStack_16b30 = (fdb_kvs_handle *)0x110824;
    compaction_daemon_test();
LAB_00110824:
    pfStack_16b30 = (fdb_kvs_handle *)0x110829;
    compaction_daemon_test();
LAB_00110829:
    pfStack_16b30 = (fdb_kvs_handle *)0x11082e;
    compaction_daemon_test();
LAB_0011082e:
    pfStack_16b30 = (fdb_kvs_handle *)0x110833;
    compaction_daemon_test();
    pfVar18 = pfVar10;
LAB_00110833:
    pfStack_16b30 = (fdb_kvs_handle *)0x110838;
    compaction_daemon_test();
LAB_00110838:
    pfStack_16b30 = (fdb_kvs_handle *)0x11083d;
    compaction_daemon_test();
LAB_0011083d:
    pfStack_16b30 = (fdb_kvs_handle *)0x110842;
    compaction_daemon_test();
LAB_00110842:
    pfStack_16b30 = (fdb_kvs_handle *)0x110847;
    compaction_daemon_test();
LAB_00110847:
    pfStack_16b30 = (fdb_kvs_handle *)0x11084c;
    compaction_daemon_test();
LAB_0011084c:
    pfStack_16b30 = (fdb_kvs_handle *)0x110851;
    compaction_daemon_test();
LAB_00110851:
    pfStack_16b30 = (fdb_kvs_handle *)0x110856;
    compaction_daemon_test();
LAB_00110856:
    pfStack_16b30 = (fdb_kvs_handle *)0x11085b;
    compaction_daemon_test();
LAB_0011085b:
    pfStack_16b30 = (fdb_kvs_handle *)0x110860;
    compaction_daemon_test();
LAB_00110860:
    pfStack_16b30 = (fdb_kvs_handle *)0x110865;
    compaction_daemon_test();
LAB_00110865:
    pfStack_16b30 = (fdb_kvs_handle *)0x11086a;
    compaction_daemon_test();
LAB_0011086a:
    pfStack_16b30 = (fdb_kvs_handle *)0x11086f;
    compaction_daemon_test();
LAB_0011086f:
    pfStack_16b30 = (fdb_kvs_handle *)0x110874;
    compaction_daemon_test();
LAB_00110874:
    pfStack_16b30 = (fdb_kvs_handle *)0x110879;
    compaction_daemon_test();
LAB_00110879:
    pfStack_16b30 = (fdb_kvs_handle *)0x11087e;
    compaction_daemon_test();
LAB_0011087e:
    pfStack_16b30 = (fdb_kvs_handle *)0x110883;
    compaction_daemon_test();
LAB_00110883:
    pfStack_16b30 = (fdb_kvs_handle *)0x110888;
    compaction_daemon_test();
LAB_00110888:
    pfStack_16b30 = (fdb_kvs_handle *)0x11088d;
    compaction_daemon_test();
LAB_0011088d:
    pfStack_16b30 = (fdb_kvs_handle *)0x110892;
    compaction_daemon_test();
LAB_00110892:
    pfStack_16b30 = (fdb_kvs_handle *)0x110897;
    compaction_daemon_test();
LAB_00110897:
    pfStack_16b30 = (fdb_kvs_handle *)0x11089c;
    compaction_daemon_test();
LAB_0011089c:
    pfStack_16b30 = (fdb_kvs_handle *)0x1108a1;
    compaction_daemon_test();
LAB_001108a1:
    pfStack_16b30 = (fdb_kvs_handle *)0x1108a6;
    compaction_daemon_test();
LAB_001108a6:
    pfStack_16b30 = (fdb_kvs_handle *)0x1108ab;
    compaction_daemon_test();
LAB_001108ab:
    pfStack_16b30 = (fdb_kvs_handle *)0x1108b0;
    compaction_daemon_test();
LAB_001108b0:
    pfStack_16b30 = (fdb_kvs_handle *)0x1108b5;
    compaction_daemon_test();
LAB_001108b5:
    pfStack_16b30 = (fdb_kvs_handle *)0x1108ba;
    compaction_daemon_test();
LAB_001108ba:
    pfStack_16b30 = (fdb_kvs_handle *)0x1108bf;
    compaction_daemon_test();
LAB_001108bf:
    pfStack_16b30 = (fdb_kvs_handle *)0x1108c4;
    compaction_daemon_test();
LAB_001108c4:
    pfStack_16b30 = (fdb_kvs_handle *)0x1108c9;
    compaction_daemon_test();
LAB_001108c9:
    pfStack_16b30 = (fdb_kvs_handle *)0x1108ce;
    compaction_daemon_test();
LAB_001108ce:
    pfStack_16b30 = (fdb_kvs_handle *)0x1108d3;
    compaction_daemon_test();
LAB_001108d3:
    pfStack_16b30 = (fdb_kvs_handle *)0x1108d8;
    compaction_daemon_test();
LAB_001108d8:
    pfStack_16b30 = (fdb_kvs_handle *)0x1108dd;
    compaction_daemon_test();
LAB_001108dd:
    pfStack_16b30 = (fdb_kvs_handle *)0x1108e2;
    compaction_daemon_test();
LAB_001108e2:
    pfStack_16b30 = (fdb_kvs_handle *)0x1108e7;
    compaction_daemon_test();
LAB_001108e7:
    pfStack_16b30 = (fdb_kvs_handle *)0x1108ec;
    compaction_daemon_test();
LAB_001108ec:
    pfStack_16b30 = (fdb_kvs_handle *)0x1108f1;
    compaction_daemon_test();
  }
  pfStack_16b30 = (fdb_kvs_handle *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_16cc8 = (fdb_kvs_handle *)0x110916;
  aStack_16b58 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar16;
  pfStack_16b50 = handle;
  pfStack_16b48 = doc;
  pfStack_16b40 = pfVar15;
  ppfStack_16b38 = (fdb_doc **)_Var28._M_i;
  pfStack_16b30 = pfVar18;
  gettimeofday(&tStack_16c78,(__timezone_ptr_t)0x0);
  pfStack_16cc8 = (fdb_kvs_handle *)0x11091b;
  memleak_start();
  pfStack_16cc8 = (fdb_kvs_handle *)0x110927;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_16cc8 = (fdb_kvs_handle *)0x110934;
  fdb_get_default_config();
  uStack_16c22 = 1;
  uStack_16c18._0_2_ = 1;
  uStack_16c18._2_2_ = 0;
  uStack_16c18._4_4_ = 0;
  pfStack_16cc8 = (fdb_kvs_handle *)0x110955;
  fVar3 = fdb_open(&pfStack_16cb8,"compact_test",(fdb_config *)(auStack_16c68 + 0x18));
  pfVar24 = (fdb_config *)(auStack_16c68 + 0x18);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfVar24 = (fdb_config *)auStack_16c68;
    pfStack_16cc8 = (fdb_kvs_handle *)0x11096a;
    fdb_get_default_kvs_config();
    pfStack_16cc8 = (fdb_kvs_handle *)0x11097c;
    fVar3 = fdb_kvs_open_default(pfStack_16cb8,&pfStack_16cb0,(fdb_kvs_config *)pfVar24);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110aad;
    pfStack_16cc8 = (fdb_kvs_handle *)0x110993;
    gettimeofday(&tStack_16c88,(__timezone_ptr_t)0x0);
    pfStack_16cc8 = (fdb_kvs_handle *)0x1109a3;
    printf("wait for %d seconds..\n",(ulong)pcVar11 & 0xffffffff);
    tVar29.tv_usec = tStack_16c88.tv_usec;
    tVar29.tv_sec = tStack_16c88.tv_sec;
    doc = (fdb_kvs_handle *)((long)&atStack_16ca8[1].tv_sec + 1);
    pfVar18 = (fdb_kvs_handle *)0x0;
    do {
      iVar4 = (int)pfVar18;
      pfStack_16cc8 = (fdb_kvs_handle *)0x1109c4;
      sprintf((char *)doc,"%d",pfVar18);
      handle = pfStack_16cb0;
      pfStack_16cc8 = (fdb_kvs_handle *)0x1109d1;
      sVar5 = strlen((char *)doc);
      pfStack_16cc8 = (fdb_kvs_handle *)0x1109ec;
      fVar3 = fdb_set_kv(handle,doc,sVar5,"value",5);
      pfVar24 = (fdb_config *)tStack_16c88.tv_sec;
      _Var28._M_i = tStack_16c88.tv_usec;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00110aa3:
        pfStack_16cc8 = (fdb_kvs_handle *)0x110aa8;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa8;
      }
      pfStack_16cc8 = (fdb_kvs_handle *)0x110a00;
      fVar3 = fdb_commit(pfStack_16cb8,'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_16cc8 = (fdb_kvs_handle *)0x110aa3;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa3;
      }
      pfStack_16cc8 = (fdb_kvs_handle *)0x110a14;
      gettimeofday((timeval *)atStack_16ca8,(__timezone_ptr_t)0x0);
      pfStack_16cc8 = (fdb_kvs_handle *)0x110a29;
      tVar30 = _utime_gap(tVar29,atStack_16ca8[0]);
    } while (((fdb_kvs_handle *)tVar30.tv_sec < pcVar11) &&
            (pfVar18 = (fdb_kvs_handle *)(ulong)(iVar4 + 1), iVar4 != 99999));
    pfStack_16cc8 = (fdb_kvs_handle *)0x110a49;
    fVar3 = fdb_close(pfStack_16cb8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ab2;
    pfStack_16cc8 = (fdb_kvs_handle *)0x110a52;
    fVar3 = fdb_shutdown();
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_16cc8 = (fdb_kvs_handle *)0x110a5b;
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      pfStack_16cc8 = (fdb_kvs_handle *)0x110a8c;
      fprintf(_stderr,pcVar11,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110aa8:
    pfStack_16cc8 = (fdb_kvs_handle *)0x110aad;
    auto_compaction_with_concurrent_insert_test();
LAB_00110aad:
    pfStack_16cc8 = (fdb_kvs_handle *)0x110ab2;
    auto_compaction_with_concurrent_insert_test();
LAB_00110ab2:
    pfStack_16cc8 = (fdb_kvs_handle *)0x110ab7;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_16cc8 = (fdb_kvs_handle *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_16cf0 = (fdb_kvs_handle *)pcVar11;
  pfStack_16ce8 = handle;
  pfStack_16ce0 = doc;
  pfStack_16cd8 = pfVar24;
  ppfStack_16cd0 = (fdb_doc **)_Var28._M_i;
  pfStack_16cc8 = pfVar18;
  gettimeofday(&tStack_16ff8,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_17068._32_8_ = (btree *)0x0;
  auStack_17068._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_16de8.wal_threshold = 0x1000;
  fStack_16de8.compaction_mode = '\x01';
  fStack_16de8.compaction_threshold = '\n';
  fStack_16de8.compactor_sleep_duration = 1;
  info_00 = (fdb_file_info *)0x14e0c5;
  pfVar10 = (fdb_kvs_handle *)&pfStack_17088;
  kvs_config_00 = (fdb_file_info *)0x1;
  fVar3 = fdb_open_custom_cmp((fdb_file_handle **)pfVar10,"compact_test",&fStack_16de8,1,
                              (char **)(auStack_17068 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_17068 + 0x18),(void **)0x0);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_17068._16_8_ = afStack_16fe8[0].doc_count;
    auStack_17068._0_8_ = afStack_16fe8[0].filename;
    auStack_17068._8_8_ = afStack_16fe8[0].new_filename;
    info_00 = (fdb_file_info *)auStack_17080;
    pfVar10 = pfStack_17088;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_17088,(fdb_kvs_handle **)info_00,
                       (fdb_kvs_config *)auStack_17068);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110eb4;
    info_00 = (fdb_file_info *)auStack_17070;
    kvs_config_00 = (fdb_file_info *)auStack_17068;
    pfVar10 = pfStack_17088;
    fVar3 = fdb_kvs_open((fdb_file_handle *)pfStack_17088,(fdb_kvs_handle **)info_00,"db",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110eb9;
    uVar22 = 0;
    do {
      sprintf((char *)afStack_16fe8,"key%06d",uVar22);
      sprintf((char *)afStack_16ee8,"body%06d",uVar22);
      pfVar10 = (fdb_kvs_handle *)auStack_17080._0_8_;
      sVar5 = strlen((char *)afStack_16fe8);
      sVar6 = strlen((char *)afStack_16ee8);
      kvs_config_00 = afStack_16ee8;
      info_00 = afStack_16fe8;
      fVar3 = fdb_set_kv(pfVar10,afStack_16fe8,sVar5,afStack_16ee8,sVar6);
      handle_00 = auStack_17070;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00110e9b:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110ea0;
      }
      sVar5 = strlen((char *)afStack_16fe8);
      sVar6 = strlen((char *)afStack_16ee8);
      kvs_config_00 = afStack_16ee8;
      info_00 = afStack_16fe8;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)handle_00,afStack_16fe8,sVar5,afStack_16ee8,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar10 = (fdb_kvs_handle *)handle_00;
        goto LAB_00110e9b;
      }
      uVar20 = (int)uVar22 + 1;
      uVar22 = (ulong)uVar20;
    } while (uVar20 != 10000);
    kvs_config_00 = (fdb_file_info *)auStack_17068;
    auStack_17068._8_8_ = _compact_test_keycmp;
    info_00 = (fdb_file_info *)(auStack_17080 + 8);
    pfVar10 = pfStack_17088;
    fVar3 = fdb_kvs_open((fdb_file_handle *)pfStack_17088,(fdb_kvs_handle **)info_00,"db_custom",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ebe;
    info_00 = afStack_16fe8;
    sprintf((char *)info_00,"key%06d",0);
    kvs_config_00 = afStack_16ee8;
    sprintf((char *)kvs_config_00,"body%06d",0);
    sVar5 = strlen((char *)info_00);
    sVar6 = strlen((char *)kvs_config_00);
    fVar3 = fdb_set_kv((fdb_kvs_handle *)auStack_17080._8_8_,info_00,sVar5,kvs_config_00,sVar6);
    pfVar10 = (fdb_kvs_handle *)auStack_17080._8_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ec3;
    info_00 = (fdb_file_info *)0x0;
    pfVar10 = pfStack_17088;
    fVar3 = fdb_commit((fdb_file_handle *)pfStack_17088,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ec8;
    uVar22 = 0;
    uVar25 = 0;
    do {
      sprintf((char *)afStack_16fe8,"key%06d",uVar25);
      sprintf((char *)afStack_16ee8,"body%06d",uVar25);
      pfVar10 = (fdb_kvs_handle *)auStack_17080._0_8_;
      sVar5 = strlen((char *)afStack_16fe8);
      sVar6 = strlen((char *)afStack_16ee8);
      kvs_config_00 = afStack_16ee8;
      info_00 = afStack_16fe8;
      fVar3 = fdb_set_kv(pfVar10,afStack_16fe8,sVar5,afStack_16ee8,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ea5;
      info_00 = (fdb_file_info *)(auStack_17068 + 0x28);
      pfVar10 = pfStack_17088;
      fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_17088,info_00);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ea0;
      if (uVar22 < uStack_17018) {
        uVar22 = uStack_17018;
      }
      uVar20 = (int)uVar25 + 1;
      uVar25 = (ulong)uVar20;
    } while (uVar20 != 10000);
    info_00 = (fdb_file_info *)0x0;
    pfVar10 = pfStack_17088;
    fVar3 = fdb_commit((fdb_file_handle *)pfStack_17088,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ecd;
    info_00 = (fdb_file_info *)(auStack_17068 + 0x28);
    pfVar10 = pfStack_17088;
    fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_17088,info_00);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ed2;
    if (uVar22 < uStack_17018) {
      uVar22 = uStack_17018;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar22);
    do {
      sleep(1);
      info_00 = (fdb_file_info *)(auStack_17068 + 0x28);
      pfVar10 = pfStack_17088;
      fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_17088,
                                (fdb_file_info *)(auStack_17068 + 0x28));
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110eaa;
    } while (uVar22 <= uStack_17018);
    fVar3 = fdb_close((fdb_file_handle *)pfStack_17088);
    pfVar10 = pfStack_17088;
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_shutdown();
      pfVar10 = pfStack_17088;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar11 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar11 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar11,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110edc;
    }
  }
  else {
LAB_00110eaf:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb4:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb9:
    auto_compaction_with_custom_cmp_function();
LAB_00110ebe:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec3:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec8:
    auto_compaction_with_custom_cmp_function();
LAB_00110ecd:
    auto_compaction_with_custom_cmp_function();
LAB_00110ed2:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110edc:
  auto_compaction_with_custom_cmp_function();
  if (info_00 == kvs_config_00) {
    memcmp(pfVar10,__s2,(size_t)info_00);
    return;
  }
  if (info_00 < kvs_config_00) {
    kvs_config_00 = info_00;
  }
  memcmp(pfVar10,__s2,(size_t)kvs_config_00);
  return;
LAB_0010eacf:
  pfStack_13a8 = (fdb_kvs_handle *)0x10ead4;
  compact_upto_test();
LAB_0010ead4:
  pfStack_13a8 = (fdb_kvs_handle *)0x10ead9;
  compact_upto_test();
LAB_0010ead9:
  pfStack_13a8 = (fdb_kvs_handle *)0x10eade;
  compact_upto_test();
LAB_0010eade:
  pfStack_13a8 = (fdb_kvs_handle *)0x10eae3;
  compact_upto_test();
LAB_0010eae3:
  pfStack_13a8 = (fdb_kvs_handle *)0x10eae8;
  compact_upto_test();
  goto LAB_0010eae8;
LAB_001107eb:
  pfStack_16b30 = (fdb_kvs_handle *)0x1107f6;
  compaction_daemon_test();
  pfVar10 = pfVar18;
LAB_001107f6:
  pfVar18 = pfVar10;
  pfStack_16b30 = (fdb_kvs_handle *)0x1107fb;
  compaction_daemon_test();
LAB_001107fb:
  pfStack_16b30 = (fdb_kvs_handle *)0x110806;
  pcVar11 = (char *)handle;
  compaction_daemon_test();
  pfVar10 = pfVar18;
LAB_00110806:
  _Var28._M_i = (__int_type_conflict)apfStack_16928;
  pcVar16 = "key%04d";
  pfStack_16b30 = (fdb_kvs_handle *)0x11080b;
  compaction_daemon_test();
  goto LAB_0011080b;
LAB_00110ea0:
  auto_compaction_with_custom_cmp_function();
LAB_00110ea5:
  auto_compaction_with_custom_cmp_function();
LAB_00110eaa:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110eaf;
}

Assistant:

void estimate_space_upto_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, j, r;
    int n = 300;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;
    fdb_snapshot_info_t *markers;
    uint64_t num_markers;
    size_t space_used;

    char keybuf[256], metabuf[256], bodybuf[256];
    char kv_name[8];

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 50;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    fconfig.block_reusing_threshold = 0;

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

   // ------- Setup test ----------------------------------
   // insert first quarter of documents
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert second quarter of documents
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // Update first quarter of documents again..
    for (j = 0; j < n/4; j++){
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[j]);
        }
    }
    // Update first quarter of documents again overwriting previous update..
    for (j = 0; j < n/4; j++){
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[j]);
        }
    }

    // commit again without a WAL flush (some of these docs remain in WAL)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert third quarter of documents
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert fourth quarter of documents
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush (some of these docs remain in the WAL)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "estimate_space_upto_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    if (!multi_kv) {
        size_t space_used2;
        TEST_CHK(num_markers == 4);
        space_used = fdb_estimate_space_used_from(dbfile, markers[1].marker);
        space_used2 = fdb_estimate_space_used_from(dbfile, markers[2].marker);
        TEST_CHK(space_used2 > space_used); // greater than space used by just 1
    } else {
        size_t space_used2;
        TEST_CHK(num_markers == 8);
        space_used = fdb_estimate_space_used_from(dbfile, markers[1].marker);
        space_used2 = fdb_estimate_space_used_from(dbfile, markers[2].marker);
        TEST_CHK(space_used2 > space_used); // greater than space used by just 1
    }

    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "estimate space upto marker in file test %s", multi_kv ?
                                                           "multiple kv mode:"
                                                         : "single kv mode:");
    TEST_RESULT(bodybuf);
}